

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86_avx::forward_inplace(LayerNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 (*pauVar15) [32];
  float *pfVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  uint uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  float *pfVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  float *pfVar33;
  float fVar34;
  float fVar35;
  float fVar95;
  float fVar96;
  __m128 _high;
  undefined1 auVar42 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar65 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar97;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  float fVar125;
  __m128 _a_128_3;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar103 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar126;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar108 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar113 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float _a;
  float fVar127;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar148;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 in_ZMM2 [64];
  float _b;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 in_ZMM6 [64];
  __m128 _low;
  undefined1 auVar183 [28];
  undefined1 auVar184 [28];
  undefined1 auVar185 [28];
  undefined1 auVar182 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar207;
  float fVar208;
  __m128 _b_128;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar209;
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  __m128 _low_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [32];
  undefined1 auVar217 [32];
  undefined1 auVar219 [32];
  undefined1 auVar213 [16];
  undefined1 auVar220 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar254 [64];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar144 [32];
  undefined1 auVar193 [32];
  undefined1 auVar214 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  
  auVar114 = in_ZMM6._0_16_;
  auVar134 = in_ZMM14._0_16_;
  iVar18 = bottom_top_blob->elempack;
  iVar17 = bottom_top_blob->dims;
  iVar1 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86_avx;
  p_Var3 = pp_Var2[-3];
  pfVar22 = *(float **)(&this->field_0xe0 + (long)p_Var3);
  pfVar33 = *(float **)(&this->field_0x128 + (long)p_Var3);
  if (iVar17 == 1) {
    uVar24 = iVar1 * iVar18;
    pauVar25 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar15 = pauVar25;
    if ((int)uVar24 < 8) {
      uVar23 = 0;
      auVar93 = ZEXT832(0);
    }
    else {
      uVar23 = uVar24 & 0x7ffffff8;
      auVar174 = ZEXT864(0);
      iVar18 = 8;
      do {
        auVar93._0_4_ = auVar174._0_4_ + *(float *)*pauVar15;
        auVar93._4_4_ = auVar174._4_4_ + *(float *)(*pauVar15 + 4);
        auVar93._8_4_ = auVar174._8_4_ + *(float *)(*pauVar15 + 8);
        auVar93._12_4_ = auVar174._12_4_ + *(float *)(*pauVar15 + 0xc);
        auVar93._16_4_ = auVar174._16_4_ + *(float *)(*pauVar15 + 0x10);
        auVar93._20_4_ = auVar174._20_4_ + *(float *)(*pauVar15 + 0x14);
        auVar93._24_4_ = auVar174._24_4_ + *(float *)(*pauVar15 + 0x18);
        auVar93._28_4_ = auVar174._28_4_ + *(float *)(*pauVar15 + 0x1c);
        auVar174 = ZEXT3264(auVar93);
        pauVar15 = pauVar15 + 1;
        iVar18 = iVar18 + 8;
      } while (iVar18 <= (int)uVar24);
    }
    uVar28 = uVar23 | 4;
    auVar114 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar34 = auVar114._4_4_;
      fVar35 = auVar114._8_4_;
      fVar98 = auVar114._12_4_;
      if ((int)uVar24 < (int)uVar28) break;
      auVar114._0_4_ = auVar114._0_4_ + *(float *)*pauVar15;
      auVar114._4_4_ = fVar34 + *(float *)(*pauVar15 + 4);
      auVar114._8_4_ = fVar35 + *(float *)(*pauVar15 + 8);
      auVar114._12_4_ = fVar98 + *(float *)(*pauVar15 + 0xc);
      pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
      uVar28 = uVar23 + 8;
      uVar23 = uVar23 + 4;
    }
    fVar95 = 0.0;
    if ((int)uVar23 < (int)uVar24) {
      uVar30 = CONCAT44(0,~uVar23 + uVar24);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uVar30;
      auVar69 = vpshufd_avx(auVar134,0x44);
      uVar31 = 0;
      auVar167._8_8_ = 0x8000000000000000;
      auVar167._0_8_ = 0x8000000000000000;
      auVar153 = vorps_avx(auVar69,auVar167);
      auVar115 = vorps_avx(auVar69,auVar167);
      auVar168 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar178 = vorps_avx(auVar69,auVar167);
      auVar174 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar254 = auVar174;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = uVar31;
        auVar134 = vpshufd_avx(auVar199,0x44);
        auVar235._16_16_ = auVar134;
        auVar235._0_16_ = auVar134;
        auVar94 = vorps_avx(auVar235,_DAT_0054f040);
        auVar235 = vorps_avx(auVar235,_DAT_0054f060);
        auVar239._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
        auVar239._8_4_ = auVar235._24_4_;
        auVar239._12_4_ = auVar235._28_4_ ^ 0x80000000;
        auVar199 = vpcmpgtq_avx(auVar239,auVar153);
        auVar252._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
        auVar252._8_4_ = auVar235._8_4_;
        auVar252._12_4_ = auVar235._12_4_ ^ 0x80000000;
        auVar134 = vpcmpgtq_avx(auVar252,auVar115);
        auVar135 = vpackssdw_avx(auVar134,auVar199);
        auVar253._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
        auVar253._8_4_ = auVar94._24_4_;
        auVar253._12_4_ = auVar94._28_4_ ^ 0x80000000;
        auVar134 = vpcmpgtq_avx(auVar253,auVar153);
        auVar152._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
        auVar152._8_4_ = auVar94._8_4_;
        auVar152._12_4_ = auVar94._12_4_ ^ 0x80000000;
        auVar152 = vpcmpgtq_avx(auVar152,auVar178);
        auVar152 = vpackssdw_avx(auVar152,auVar134);
        auVar135 = vpackssdw_avx(auVar168 ^ auVar152,auVar135 ^ auVar168);
        auVar152 = vpmovsxwd_avx(auVar135);
        auVar135 = vpunpckhwd_avx(auVar135,auVar135);
        auVar154._16_16_ = auVar135;
        auVar154._0_16_ = auVar152;
        auVar154 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])(*pauVar15 + uVar31 * 4));
        auVar135._0_4_ = auVar154._0_4_ + auVar254._0_4_;
        auVar135._4_4_ = auVar154._4_4_ + auVar254._4_4_;
        auVar135._8_4_ = auVar154._8_4_ + auVar254._8_4_;
        auVar135._12_4_ = auVar154._12_4_ + auVar254._12_4_;
        auVar144._16_4_ = auVar154._16_4_ + auVar254._16_4_;
        auVar144._0_16_ = auVar135;
        auVar144._20_4_ = auVar154._20_4_ + auVar254._20_4_;
        auVar144._24_4_ = auVar154._24_4_ + auVar254._24_4_;
        auVar144._28_4_ = auVar154._28_4_ + auVar254._28_4_;
        uVar31 = uVar31 + 8;
        auVar174 = ZEXT3264(auVar144);
      } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
      auVar153 = vorps_avx(auVar69,auVar167);
      auVar178._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
      auVar178._8_4_ = auVar235._8_4_;
      auVar178._12_4_ = auVar235._12_4_ ^ 0x80000000;
      auVar153 = vpcmpgtq_avx(auVar178,auVar153);
      auVar115 = vpackssdw_avx(auVar153,auVar199);
      auVar178 = vpcmpeqd_avx(auVar178,auVar178);
      auVar153 = vorps_avx(auVar69,auVar167);
      auVar168._8_4_ = auVar94._8_4_;
      auVar168._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
      auVar168._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar153 = vpcmpgtq_avx(auVar168,auVar153);
      auVar153 = vpackssdw_avx(auVar153,auVar134);
      auVar153 = vblendvps_avx(auVar254._0_16_,auVar135,auVar153 ^ auVar178);
      auVar115 = vblendvps_avx(auVar254._16_16_,auVar144._16_16_,auVar115 ^ auVar178);
      auVar153 = vhaddps_avx(auVar115,auVar153);
      auVar153 = vhaddps_avx(auVar153,auVar153);
      auVar153 = vhaddps_avx(auVar153,auVar153);
      fVar95 = auVar153._0_4_;
    }
    auVar153 = vshufpd_avx(auVar114,auVar114,1);
    auVar115._0_4_ = auVar153._0_4_ + auVar114._0_4_;
    auVar115._4_4_ = auVar153._4_4_ + fVar34;
    auVar115._8_4_ = auVar153._8_4_ + fVar35;
    auVar115._12_4_ = auVar153._12_4_ + fVar98;
    auVar114 = vhaddps_avx(auVar93._16_16_,auVar93._0_16_);
    auVar153 = vmovshdup_avx(auVar115);
    auVar114 = vhaddps_avx(auVar114,auVar114);
    auVar114 = vhaddps_avx(auVar114,auVar114);
    fVar34 = (auVar114._0_4_ + auVar153._0_4_ + auVar115._0_4_ + fVar95) / (float)(int)uVar24;
    auVar114 = vshufps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),0);
    pauVar15 = pauVar25;
    if ((int)uVar24 < 8) {
      uVar23 = 0;
      auVar145 = ZEXT1232(ZEXT812(0)) << 0x20;
    }
    else {
      auVar94._16_16_ = auVar114;
      auVar94._0_16_ = auVar114;
      uVar23 = uVar24 & 0x7ffffff8;
      auVar174 = ZEXT864(0) << 0x40;
      iVar18 = 8;
      do {
        auVar93 = vsubps_avx(*pauVar15,auVar94);
        auVar145._0_4_ = auVar93._0_4_ * auVar93._0_4_ + auVar174._0_4_;
        auVar145._4_4_ = auVar93._4_4_ * auVar93._4_4_ + auVar174._4_4_;
        auVar145._8_4_ = auVar93._8_4_ * auVar93._8_4_ + auVar174._8_4_;
        auVar145._12_4_ = auVar93._12_4_ * auVar93._12_4_ + auVar174._12_4_;
        auVar145._16_4_ = auVar93._16_4_ * auVar93._16_4_ + auVar174._16_4_;
        auVar145._20_4_ = auVar93._20_4_ * auVar93._20_4_ + auVar174._20_4_;
        auVar145._24_4_ = auVar93._24_4_ * auVar93._24_4_ + auVar174._24_4_;
        auVar145._28_4_ = auVar93._28_4_ + auVar174._28_4_;
        auVar174 = ZEXT3264(auVar145);
        pauVar15 = pauVar15 + 1;
        iVar18 = iVar18 + 8;
      } while (iVar18 <= (int)uVar24);
    }
    uVar28 = uVar23 | 4;
    auVar153 = ZEXT816(0) << 0x20;
    while( true ) {
      fVar35 = auVar153._4_4_;
      fVar98 = auVar153._8_4_;
      fVar95 = auVar153._12_4_;
      if ((int)uVar24 < (int)uVar28) break;
      auVar115 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar114);
      auVar153._0_4_ = auVar115._0_4_ * auVar115._0_4_ + auVar153._0_4_;
      auVar153._4_4_ = auVar115._4_4_ * auVar115._4_4_ + fVar35;
      auVar153._8_4_ = auVar115._8_4_ * auVar115._8_4_ + fVar98;
      auVar153._12_4_ = auVar115._12_4_ * auVar115._12_4_ + fVar95;
      pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
      uVar28 = uVar23 + 8;
      uVar23 = uVar23 + 4;
    }
    fVar96 = *(float *)(&this->field_0xd4 + (long)p_Var3);
    fVar97 = 0.0;
    if ((int)uVar23 < (int)uVar24) {
      uVar30 = CONCAT44(0,~uVar23 + uVar24);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar30;
      auVar168 = vpshufd_avx(auVar69,0x44);
      auVar198._16_16_ = auVar114;
      auVar198._0_16_ = auVar114;
      uVar31 = 0;
      auVar179._8_8_ = 0x8000000000000000;
      auVar179._0_8_ = 0x8000000000000000;
      auVar114 = vorps_avx(auVar168,auVar179);
      auVar115 = vorps_avx(auVar168,auVar179);
      auVar178 = vpcmpeqd_avx(auVar134,auVar134);
      auVar134 = vorps_avx(auVar168,auVar179);
      auVar174 = ZEXT1264(ZEXT812(0));
      do {
        auVar254 = auVar174;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = uVar31;
        auVar69 = vpshufd_avx(auVar116,0x44);
        auVar124._16_16_ = auVar69;
        auVar124._0_16_ = auVar69;
        auVar93 = vorps_avx(auVar124,_DAT_0054f040);
        auVar94 = vorps_avx(_DAT_0054f060,auVar124);
        auVar169._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
        auVar169._8_4_ = auVar94._24_4_;
        auVar169._12_4_ = auVar94._28_4_ ^ 0x80000000;
        auVar135 = vpcmpgtq_avx(auVar169,auVar114);
        auVar180._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
        auVar117._8_4_ = auVar94._8_4_;
        auVar180._8_4_ = auVar117._8_4_;
        auVar180._12_4_ = auVar94._12_4_ ^ 0x80000000;
        auVar69 = vpcmpgtq_avx(auVar180,auVar115);
        auVar69 = vpackssdw_avx(auVar69,auVar135);
        auVar181._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
        auVar181._8_4_ = auVar93._24_4_;
        auVar181._12_4_ = auVar93._28_4_ ^ 0x80000000;
        auVar152 = vpcmpgtq_avx(auVar181,auVar114);
        auVar200._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
        auVar200._8_4_ = auVar93._8_4_;
        auVar200._12_4_ = auVar93._12_4_ ^ 0x80000000;
        auVar167 = vpcmpgtq_avx(auVar200,auVar134);
        auVar167 = vpackssdw_avx(auVar167,auVar152);
        auVar69 = vpackssdw_avx(auVar167 ^ auVar178,auVar178 ^ auVar69);
        auVar167 = vpmovsxwd_avx(auVar69);
        auVar69 = vpunpckhwd_avx(auVar69,auVar69);
        auVar192._16_16_ = auVar69;
        auVar192._0_16_ = auVar167;
        auVar235 = vmaskmovps_avx(auVar192,*(undefined1 (*) [32])(*pauVar15 + uVar31 * 4));
        auVar235 = vsubps_avx(auVar235,auVar198);
        auVar182._0_4_ = auVar235._0_4_ * auVar235._0_4_ + auVar254._0_4_;
        auVar182._4_4_ = auVar235._4_4_ * auVar235._4_4_ + auVar254._4_4_;
        auVar182._8_4_ = auVar235._8_4_ * auVar235._8_4_ + auVar254._8_4_;
        auVar182._12_4_ = auVar235._12_4_ * auVar235._12_4_ + auVar254._12_4_;
        auVar193._16_4_ = auVar235._16_4_ * auVar235._16_4_ + auVar254._16_4_;
        auVar193._0_16_ = auVar182;
        auVar193._20_4_ = auVar235._20_4_ * auVar235._20_4_ + auVar254._20_4_;
        auVar193._24_4_ = auVar235._24_4_ * auVar235._24_4_ + auVar254._24_4_;
        auVar193._28_4_ = auVar235._28_4_ + auVar254._28_4_;
        uVar31 = uVar31 + 8;
        auVar174 = ZEXT3264(auVar193);
      } while ((uVar30 + 8 & 0x1fffffff8) != uVar31);
      auVar134 = vorps_avx(auVar168,auVar179);
      auVar117._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
      auVar117._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar134 = vpcmpgtq_avx(auVar117,auVar134);
      auVar114 = vpackssdw_avx(auVar134,auVar135);
      auVar115 = vpcmpeqd_avx(auVar135,auVar135);
      auVar134 = vorps_avx(auVar168,auVar179);
      auVar134 = vpcmpgtq_avx(auVar93._0_16_ ^ auVar179,auVar134);
      auVar134 = vpackssdw_avx(auVar134,auVar152);
      auVar134 = vblendvps_avx(auVar254._0_16_,auVar182,auVar134 ^ auVar115);
      auVar114 = vblendvps_avx(auVar254._16_16_,auVar193._16_16_,auVar114 ^ auVar115);
      auVar134 = vhaddps_avx(auVar114,auVar134);
      auVar134 = vhaddps_avx(auVar134,auVar134);
      auVar134 = vhaddps_avx(auVar134,auVar134);
      fVar97 = auVar134._0_4_;
    }
    fVar146 = 0.0;
    auVar134 = vhaddps_avx(auVar145._16_16_,auVar145._0_16_);
    auVar134 = vhaddps_avx(auVar134,auVar134);
    auVar114 = vshufpd_avx(auVar153,auVar153,1);
    auVar134 = vhaddps_avx(auVar134,auVar134);
    auVar136._0_4_ = auVar114._0_4_ + auVar153._0_4_;
    auVar136._4_4_ = auVar114._4_4_ + fVar35;
    auVar136._8_4_ = auVar114._8_4_ + fVar98;
    auVar136._12_4_ = auVar114._12_4_ + fVar95;
    auVar114 = vmovshdup_avx(auVar136);
    fVar35 = (auVar134._0_4_ + auVar114._0_4_ + auVar136._0_4_ + fVar97) / (float)(int)uVar24 +
             fVar96;
    auVar134 = vrsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
    fVar98 = auVar134._0_4_;
    fVar97 = fVar98 * -0.5 * (fVar35 * fVar98 * fVar98 + -3.0);
    fVar127 = 0.0;
    fVar207 = fVar97 * -fVar34;
    auVar134 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
    auVar114 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
    uVar23 = 0;
    fVar208 = auVar134._0_4_;
    fVar209 = auVar134._4_4_;
    fVar125 = auVar134._8_4_;
    fVar126 = auVar134._12_4_;
    fVar34 = auVar114._0_4_;
    fVar35 = auVar114._4_4_;
    fVar98 = auVar114._8_4_;
    fVar95 = auVar114._12_4_;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      if (7 < (int)uVar24) {
        uVar23 = uVar24 & 0x7ffffff8;
        iVar18 = 8;
        do {
          fVar97 = *(float *)(*pauVar25 + 4);
          fVar207 = *(float *)(*pauVar25 + 8);
          fVar146 = *(float *)(*pauVar25 + 0xc);
          fVar147 = *(float *)(*pauVar25 + 0x10);
          fVar148 = *(float *)(*pauVar25 + 0x14);
          fVar149 = *(float *)(*pauVar25 + 0x18);
          fVar127 = fVar127 + fVar95;
          *(float *)*pauVar25 = fVar208 * *(float *)*pauVar25 + fVar34;
          *(float *)(*pauVar25 + 4) = fVar209 * fVar97 + fVar35;
          *(float *)(*pauVar25 + 8) = fVar125 * fVar207 + fVar98;
          *(float *)(*pauVar25 + 0xc) = fVar126 * fVar146 + fVar95;
          *(float *)(*pauVar25 + 0x10) = fVar208 * fVar147 + fVar34;
          *(float *)(*pauVar25 + 0x14) = fVar209 * fVar148 + fVar35;
          *(float *)(*pauVar25 + 0x18) = fVar125 * fVar149 + fVar98;
          *(float *)(*pauVar25 + 0x1c) = fVar127;
          pauVar25 = pauVar25 + 1;
          iVar18 = iVar18 + 8;
        } while (iVar18 <= (int)uVar24);
      }
      uVar28 = uVar23 | 4;
      auVar93 = _DAT_0054f040;
      auVar94 = _DAT_0054f060;
      while (_DAT_0054f040 = auVar93, _DAT_0054f060 = auVar94, (int)uVar28 <= (int)uVar24) {
        fVar97 = *(float *)(*pauVar25 + 4);
        fVar207 = *(float *)(*pauVar25 + 8);
        fVar127 = *(float *)(*pauVar25 + 0xc);
        *(float *)*pauVar25 = fVar208 * *(float *)*pauVar25 + fVar34;
        *(float *)(*pauVar25 + 4) = fVar209 * fVar97 + fVar35;
        *(float *)(*pauVar25 + 8) = fVar125 * fVar207 + fVar98;
        *(float *)(*pauVar25 + 0xc) = fVar126 * fVar127 + fVar95;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
        uVar28 = uVar23 + 8;
        uVar23 = uVar23 + 4;
        auVar93 = _DAT_0054f040;
        auVar94 = _DAT_0054f060;
      }
      if ((int)uVar23 < (int)uVar24) {
        uVar31 = CONCAT44(0,uVar24 + ~uVar23);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = uVar31;
        auVar153 = vpshufd_avx(auVar137,0x44);
        uVar30 = 0;
        auVar170._8_8_ = 0x8000000000000000;
        auVar170._0_8_ = 0x8000000000000000;
        auVar134 = vorps_avx(auVar153,auVar170);
        auVar114 = vorps_avx(auVar153,auVar170);
        auVar115 = vpcmpeqd_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96));
        auVar153 = vorps_avx(auVar153,auVar170);
        do {
          auVar201._8_8_ = 0;
          auVar201._0_8_ = uVar30;
          auVar178 = vpshufd_avx(auVar201,0x44);
          auVar203._16_16_ = auVar178;
          auVar203._0_16_ = auVar178;
          auVar235 = vorps_avx(auVar203,auVar93);
          auVar154 = vorps_avx(auVar203,auVar94);
          auVar224._0_8_ = auVar154._16_8_ ^ 0x8000000000000000;
          auVar224._8_4_ = auVar154._24_4_;
          auVar224._12_4_ = auVar154._28_4_ ^ 0x80000000;
          auVar178 = vpcmpgtq_avx(auVar224,auVar134);
          auVar202._0_8_ = auVar154._0_8_ ^ 0x8000000000000000;
          auVar202._8_4_ = auVar154._8_4_;
          auVar202._12_4_ = auVar154._12_4_ ^ 0x80000000;
          auVar168 = vpcmpgtq_avx(auVar202,auVar114);
          auVar178 = vpackssdw_avx(auVar168,auVar178);
          auVar225._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
          auVar225._8_4_ = auVar235._24_4_;
          auVar225._12_4_ = auVar235._28_4_ ^ 0x80000000;
          auVar168 = vpcmpgtq_avx(auVar225,auVar134);
          auVar213._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
          auVar213._8_4_ = auVar235._8_4_;
          auVar213._12_4_ = auVar235._12_4_ ^ 0x80000000;
          auVar69 = vpcmpgtq_avx(auVar213,auVar153);
          auVar168 = vpackssdw_avx(auVar69,auVar168);
          auVar178 = vpackssdw_avx(auVar168 ^ auVar115,auVar178 ^ auVar115);
          auVar168 = vpmovsxwd_avx(auVar178);
          auVar178 = vpunpckhwd_avx(auVar178,auVar178);
          auVar204._16_16_ = auVar178;
          auVar204._0_16_ = auVar168;
          auVar235 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])(*pauVar25 + uVar30 * 4));
          auVar220._0_4_ = auVar235._0_4_ * fVar208 + fVar34;
          auVar220._4_4_ = auVar235._4_4_ * fVar209 + fVar35;
          auVar220._8_4_ = auVar235._8_4_ * fVar125 + fVar98;
          auVar220._12_4_ = auVar235._12_4_ * fVar126 + fVar95;
          auVar220._16_4_ = auVar235._16_4_ * fVar208 + fVar34;
          auVar220._20_4_ = auVar235._20_4_ * fVar209 + fVar35;
          auVar220._24_4_ = auVar235._24_4_ * fVar125 + fVar98;
          auVar220._28_4_ = auVar235._28_4_ + fVar95;
          auVar235 = vmaskmovps_avx(auVar204,auVar220);
          *(undefined1 (*) [32])(*pauVar25 + uVar30 * 4) = auVar235;
          uVar30 = uVar30 + 8;
        } while ((uVar31 + 8 & 0x1fffffff8) != uVar30);
      }
    }
    else {
      if (7 < (int)uVar24) {
        uVar23 = uVar24 & 0x7ffffff8;
        iVar18 = 8;
        do {
          fVar96 = *(float *)(*pauVar25 + 4);
          fVar127 = *(float *)(*pauVar25 + 8);
          fVar147 = *(float *)(*pauVar25 + 0xc);
          fVar148 = *(float *)(*pauVar25 + 0x10);
          fVar149 = *(float *)(*pauVar25 + 0x14);
          fVar150 = *(float *)(*pauVar25 + 0x18);
          fVar151 = pfVar22[1];
          fVar4 = pfVar22[2];
          fVar5 = pfVar22[3];
          fVar6 = pfVar22[4];
          fVar7 = pfVar22[5];
          fVar8 = pfVar22[6];
          fVar9 = pfVar33[1];
          fVar10 = pfVar33[2];
          fVar11 = pfVar33[3];
          fVar12 = pfVar33[4];
          fVar13 = pfVar33[5];
          fVar14 = pfVar33[6];
          fVar146 = fVar146 + fVar95 + pfVar33[7];
          *(float *)*pauVar25 = (fVar208 * *(float *)*pauVar25 + fVar34) * *pfVar22 + *pfVar33;
          *(float *)(*pauVar25 + 4) = (fVar209 * fVar96 + fVar35) * fVar151 + fVar9;
          *(float *)(*pauVar25 + 8) = (fVar125 * fVar127 + fVar98) * fVar4 + fVar10;
          *(float *)(*pauVar25 + 0xc) = (fVar126 * fVar147 + fVar95) * fVar5 + fVar11;
          *(float *)(*pauVar25 + 0x10) = (fVar208 * fVar148 + fVar34) * fVar6 + fVar12;
          *(float *)(*pauVar25 + 0x14) = (fVar209 * fVar149 + fVar35) * fVar7 + fVar13;
          *(float *)(*pauVar25 + 0x18) = (fVar125 * fVar150 + fVar98) * fVar8 + fVar14;
          *(float *)(*pauVar25 + 0x1c) = fVar146;
          pauVar25 = pauVar25 + 1;
          pfVar22 = pfVar22 + 8;
          pfVar33 = pfVar33 + 8;
          iVar18 = iVar18 + 8;
        } while (iVar18 <= (int)uVar24);
      }
      uVar28 = uVar23 | 4;
      while ((int)uVar28 <= (int)uVar24) {
        fVar96 = *(float *)(*pauVar25 + 4);
        fVar127 = *(float *)(*pauVar25 + 8);
        fVar146 = *(float *)(*pauVar25 + 0xc);
        fVar147 = pfVar22[1];
        fVar148 = pfVar22[2];
        fVar149 = pfVar22[3];
        fVar150 = pfVar33[1];
        fVar151 = pfVar33[2];
        fVar4 = pfVar33[3];
        *(float *)*pauVar25 = (fVar208 * *(float *)*pauVar25 + fVar34) * *pfVar22 + *pfVar33;
        *(float *)(*pauVar25 + 4) = (fVar209 * fVar96 + fVar35) * fVar147 + fVar150;
        *(float *)(*pauVar25 + 8) = (fVar125 * fVar127 + fVar98) * fVar148 + fVar151;
        *(float *)(*pauVar25 + 0xc) = (fVar126 * fVar146 + fVar95) * fVar149 + fVar4;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
        pfVar22 = pfVar22 + 4;
        pfVar33 = pfVar33 + 4;
        uVar28 = uVar23 + 8;
        uVar23 = uVar23 + 4;
      }
      if (uVar24 - uVar23 != 0 && (int)uVar23 <= (int)uVar24) {
        lVar21 = 0;
        do {
          *(float *)(*pauVar25 + lVar21 * 4) =
               (fVar97 * *(float *)(*pauVar25 + lVar21 * 4) + fVar207) * pfVar22[lVar21] +
               pfVar33[lVar21];
          lVar21 = lVar21 + 1;
        } while (uVar24 - uVar23 != (int)lVar21);
      }
    }
  }
  else {
    uVar24 = bottom_top_blob->h;
    uVar23 = bottom_top_blob->c;
    if (iVar17 == 3) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == iVar1) {
        if (0 < (int)uVar23) {
          pp_Var2 = this->_vptr_LayerNorm_x86_avx;
          uVar28 = iVar1 * iVar18;
          fVar34 = 1.0 / (float)iVar1;
          auVar153 = vshufps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),0);
          uVar32 = uVar28 & 0xfffffff8;
          uVar30 = 0;
          auVar174 = ZEXT3264(_DAT_0054f040);
          auVar176._8_8_ = 0x8000000000000000;
          auVar176._0_8_ = 0x8000000000000000;
          auVar134 = vpcmpeqd_avx(auVar114,auVar114);
          do {
            if (0 < (int)uVar24) {
              uVar31 = 0;
              do {
                pauVar25 = (undefined1 (*) [32])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar31 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar30 * bottom_top_blob->elemsize);
                pauVar15 = pauVar25;
                if ((int)uVar28 < 8) {
                  auVar188 = ZEXT832(0);
                  uVar19 = 0;
                }
                else {
                  auVar254 = ZEXT864(0);
                  iVar17 = 8;
                  do {
                    auVar188._0_4_ = auVar254._0_4_ + *(float *)*pauVar15;
                    auVar188._4_4_ = auVar254._4_4_ + *(float *)(*pauVar15 + 4);
                    auVar188._8_4_ = auVar254._8_4_ + *(float *)(*pauVar15 + 8);
                    auVar188._12_4_ = auVar254._12_4_ + *(float *)(*pauVar15 + 0xc);
                    auVar188._16_4_ = auVar254._16_4_ + *(float *)(*pauVar15 + 0x10);
                    auVar188._20_4_ = auVar254._20_4_ + *(float *)(*pauVar15 + 0x14);
                    auVar188._24_4_ = auVar254._24_4_ + *(float *)(*pauVar15 + 0x18);
                    auVar188._28_4_ = auVar254._28_4_ + *(float *)(*pauVar15 + 0x1c);
                    auVar254 = ZEXT3264(auVar188);
                    pauVar15 = pauVar15 + 1;
                    iVar17 = iVar17 + 8;
                    uVar19 = uVar32;
                  } while (iVar17 <= (int)uVar28);
                }
                uVar26 = uVar19 | 4;
                auVar196 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar35 = auVar196._4_4_;
                  fVar98 = auVar196._8_4_;
                  fVar95 = auVar196._12_4_;
                  if ((int)uVar28 < (int)uVar26) break;
                  auVar196._0_4_ = auVar196._0_4_ + *(float *)*pauVar15;
                  auVar196._4_4_ = fVar35 + *(float *)(*pauVar15 + 4);
                  auVar196._8_4_ = fVar98 + *(float *)(*pauVar15 + 8);
                  auVar196._12_4_ = fVar95 + *(float *)(*pauVar15 + 0xc);
                  pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
                  uVar26 = uVar19 + 8;
                  uVar19 = uVar19 + 4;
                }
                fVar96 = 0.0;
                if ((int)uVar19 < (int)uVar28) {
                  uVar20 = CONCAT44(0,~uVar19 + uVar28);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar20;
                  auVar178 = vpshufd_avx(auVar46,0x44);
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar115 = vorps_avx(auVar178,auVar176);
                  uVar27 = 0;
                  auVar254 = ZEXT464(0) << 0x40;
                  do {
                    auVar194 = auVar254;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar27;
                    auVar168 = vpshufd_avx(auVar47,0x44);
                    auVar77._16_16_ = auVar168;
                    auVar77._0_16_ = auVar168;
                    auVar93 = vorps_avx(auVar77,auVar174._0_32_);
                    auVar94 = vorps_avx(_DAT_0054f060,auVar77);
                    auVar168 = vorps_avx(auVar178,auVar176);
                    auVar48._8_4_ = auVar94._24_4_;
                    auVar48._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
                    auVar48._12_4_ = auVar94._28_4_ ^ 0x80000000;
                    auVar167 = vpcmpgtq_avx(auVar48,auVar168);
                    auVar104._8_4_ = auVar94._8_4_;
                    auVar237._8_4_ = auVar104._8_4_;
                    auVar237._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                    auVar237._12_4_ = auVar94._12_4_ ^ 0x80000000;
                    auVar69 = vpcmpgtq_avx(auVar237,auVar114);
                    auVar69 = vpackssdw_avx(auVar69,auVar167);
                    auVar248._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
                    auVar248._8_4_ = auVar93._24_4_;
                    auVar248._12_4_ = auVar93._28_4_ ^ 0x80000000;
                    auVar135 = vpcmpgtq_avx(auVar248,auVar168);
                    auVar249._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                    auVar249._8_4_ = auVar93._8_4_;
                    auVar249._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    auVar168 = vpcmpgtq_avx(auVar249,auVar115);
                    auVar168 = vpackssdw_avx(auVar168,auVar135);
                    auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
                    auVar69 = vpmovsxwd_avx(auVar168);
                    auVar168 = vpunpckhwd_avx(auVar168,auVar168);
                    auVar242._16_16_ = auVar168;
                    auVar242._0_16_ = auVar69;
                    auVar235 = vmaskmovps_avx(auVar242,*(undefined1 (*) [32])
                                                        (*pauVar15 + uVar27 * 4));
                    auVar211._0_4_ = auVar235._0_4_ + auVar194._0_4_;
                    auVar211._4_4_ = auVar235._4_4_ + auVar194._4_4_;
                    auVar211._8_4_ = auVar235._8_4_ + auVar194._8_4_;
                    auVar211._12_4_ = auVar235._12_4_ + auVar194._12_4_;
                    auVar216._16_4_ = auVar235._16_4_ + auVar194._16_4_;
                    auVar216._0_16_ = auVar211;
                    auVar216._20_4_ = auVar235._20_4_ + auVar194._20_4_;
                    auVar216._24_4_ = auVar235._24_4_ + auVar194._24_4_;
                    auVar216._28_4_ = auVar235._28_4_ + auVar194._28_4_;
                    uVar27 = uVar27 + 8;
                    auVar254 = ZEXT3264(auVar216);
                  } while ((uVar20 + 8 & 0x1fffffff8) != uVar27);
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar104._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                  auVar104._12_4_ = auVar94._12_4_ ^ 0x80000000;
                  auVar114 = vpcmpgtq_avx(auVar104,auVar114);
                  auVar115 = vpackssdw_avx(auVar114,auVar167);
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar130._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                  auVar130._8_4_ = auVar93._8_4_;
                  auVar130._12_4_ = auVar93._12_4_ ^ 0x80000000;
                  auVar114 = vpcmpgtq_avx(auVar130,auVar114);
                  auVar114 = vpackssdw_avx(auVar114,auVar135);
                  auVar114 = vblendvps_avx(auVar194._0_16_,auVar211,auVar114 ^ auVar134);
                  in_ZMM2 = ZEXT1664(auVar216._16_16_);
                  auVar115 = vblendvps_avx(auVar194._16_16_,auVar216._16_16_,auVar115 ^ auVar134);
                  auVar114 = vhaddps_avx(auVar115,auVar114);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  fVar96 = auVar114._0_4_;
                }
                local_78 = auVar153._0_4_;
                fStack_74 = auVar153._4_4_;
                fStack_70 = auVar153._8_4_;
                fStack_6c = auVar153._12_4_;
                if (iVar18 == 4) {
                  auVar196._0_4_ = auVar196._0_4_ + auVar188._16_4_ + auVar188._0_4_;
                  auVar196._4_4_ = fVar35 + auVar188._20_4_ + auVar188._4_4_;
                  auVar196._8_4_ = fVar98 + auVar188._24_4_ + auVar188._8_4_;
                  auVar196._12_4_ = fVar95 + auVar188._28_4_ + auVar188._12_4_;
                  auVar254 = ZEXT1664(CONCAT412(auVar196._12_4_ * fStack_6c,
                                                CONCAT48(auVar196._8_4_ * fStack_70,
                                                         CONCAT44(auVar196._4_4_ * fStack_74,
                                                                  auVar196._0_4_ * local_78))));
                }
                else {
                  auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (iVar18 == 8) {
                    auVar254 = ZEXT2864(CONCAT424(auVar188._24_4_ * fStack_70,
                                                  CONCAT420(auVar188._20_4_ * fStack_74,
                                                            CONCAT416(auVar188._16_4_ * local_78,
                                                                      CONCAT412(auVar188._12_4_ *
                                                                                fStack_6c,
                                                                                CONCAT48(auVar188.
                                                  _8_4_ * fStack_70,
                                                  CONCAT44(auVar188._4_4_ * fStack_74,
                                                           auVar188._0_4_ * local_78)))))));
                  }
                }
                if (iVar18 == 1) {
                  auVar114 = vshufpd_avx(auVar196,auVar196,1);
                  auVar105._0_4_ = auVar196._0_4_ + auVar114._0_4_;
                  auVar105._4_4_ = auVar196._4_4_ + auVar114._4_4_;
                  auVar105._8_4_ = auVar196._8_4_ + auVar114._8_4_;
                  auVar105._12_4_ = auVar196._12_4_ + auVar114._12_4_;
                  auVar114 = vhaddps_avx(auVar188._16_16_,auVar188._0_16_);
                  auVar115 = vmovshdup_avx(auVar105);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  fVar96 = fVar96 + auVar115._0_4_;
                  in_ZMM2 = ZEXT464((uint)fVar96);
                  auVar93 = vblendps_avx(auVar254._0_32_,
                                         ZEXT432((uint)((auVar114._0_4_ + auVar105._0_4_ + fVar96) *
                                                       fVar34)),1);
                  auVar254 = ZEXT3264(auVar93);
                }
                auVar115 = auVar254._0_16_;
                auVar114 = auVar115;
                if (iVar18 != 4) {
                  auVar114 = vshufps_avx(auVar115,auVar115,0);
                }
                auVar78 = auVar254._0_32_;
                if (iVar18 != 8) {
                  auVar78._16_16_ = auVar114;
                  auVar78._0_16_ = auVar114;
                }
                pauVar15 = pauVar25;
                if ((int)uVar28 < 8) {
                  auVar217 = SUB6432(ZEXT864(0),0) << 0x20;
                  uVar19 = 0;
                }
                else {
                  auVar194 = ZEXT864(0) << 0x20;
                  iVar17 = 8;
                  do {
                    auVar93 = vsubps_avx(*pauVar15,auVar78);
                    auVar217._0_4_ = auVar194._0_4_ + auVar93._0_4_ * auVar93._0_4_;
                    auVar217._4_4_ = auVar194._4_4_ + auVar93._4_4_ * auVar93._4_4_;
                    auVar217._8_4_ = auVar194._8_4_ + auVar93._8_4_ * auVar93._8_4_;
                    auVar217._12_4_ = auVar194._12_4_ + auVar93._12_4_ * auVar93._12_4_;
                    auVar217._16_4_ = auVar194._16_4_ + auVar93._16_4_ * auVar93._16_4_;
                    auVar217._20_4_ = auVar194._20_4_ + auVar93._20_4_ * auVar93._20_4_;
                    auVar217._24_4_ = auVar194._24_4_ + auVar93._24_4_ * auVar93._24_4_;
                    auVar217._28_4_ = auVar194._28_4_ + auVar93._28_4_;
                    auVar194 = ZEXT3264(auVar217);
                    pauVar15 = pauVar15 + 1;
                    iVar17 = iVar17 + 8;
                    uVar19 = uVar32;
                  } while (iVar17 <= (int)uVar28);
                }
                uVar26 = uVar19 | 4;
                auVar222 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar35 = auVar222._4_4_;
                  fVar98 = auVar222._8_4_;
                  fVar95 = auVar222._12_4_;
                  if ((int)uVar28 < (int)uVar26) break;
                  auVar178 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar114);
                  auVar222._0_4_ = auVar222._0_4_ + auVar178._0_4_ * auVar178._0_4_;
                  auVar222._4_4_ = fVar35 + auVar178._4_4_ * auVar178._4_4_;
                  auVar222._8_4_ = fVar98 + auVar178._8_4_ * auVar178._8_4_;
                  auVar222._12_4_ = fVar95 + auVar178._12_4_ * auVar178._12_4_;
                  pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
                  uVar26 = uVar19 + 8;
                  uVar19 = uVar19 + 4;
                }
                fVar96 = 0.0;
                if ((int)uVar19 < (int)uVar28) {
                  uVar20 = CONCAT44(0,~uVar19 + uVar28);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar20;
                  auVar178 = vpshufd_avx(auVar49,0x44);
                  auVar114 = vshufps_avx(auVar115,auVar115,0);
                  auVar243._16_16_ = auVar114;
                  auVar243._0_16_ = auVar114;
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar115 = vorps_avx(auVar178,auVar176);
                  uVar27 = 0;
                  auVar194 = ZEXT464(0) << 0x40;
                  do {
                    auVar206 = auVar194;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar27;
                    auVar168 = vpshufd_avx(auVar50,0x44);
                    auVar79._16_16_ = auVar168;
                    auVar79._0_16_ = auVar168;
                    auVar93 = vorps_avx(auVar79,auVar174._0_32_);
                    auVar94 = vorps_avx(_DAT_0054f060,auVar79);
                    auVar168 = vorps_avx(auVar178,auVar176);
                    auVar51._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
                    auVar51._8_4_ = auVar94._24_4_;
                    auVar51._12_4_ = auVar94._28_4_ ^ 0x80000000;
                    auVar167 = vpcmpgtq_avx(auVar51,auVar168);
                    auVar228._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                    auVar106._8_4_ = auVar94._8_4_;
                    auVar228._8_4_ = auVar106._8_4_;
                    auVar228._12_4_ = auVar94._12_4_ ^ 0x80000000;
                    auVar69 = vpcmpgtq_avx(auVar228,auVar114);
                    auVar69 = vpackssdw_avx(auVar69,auVar167);
                    auVar159._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
                    auVar159._8_4_ = auVar93._24_4_;
                    auVar159._12_4_ = auVar93._28_4_ ^ 0x80000000;
                    auVar135 = vpcmpgtq_avx(auVar159,auVar168);
                    auVar160._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                    auVar160._8_4_ = auVar93._8_4_;
                    auVar160._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    auVar168 = vpcmpgtq_avx(auVar160,auVar115);
                    auVar168 = vpackssdw_avx(auVar168,auVar135);
                    auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
                    auVar69 = vpmovsxwd_avx(auVar168);
                    auVar168 = vpunpckhwd_avx(auVar168,auVar168);
                    auVar172._16_16_ = auVar168;
                    auVar172._0_16_ = auVar69;
                    auVar235 = vmaskmovps_avx(auVar172,*(undefined1 (*) [32])
                                                        (*pauVar15 + uVar27 * 4));
                    auVar235 = vsubps_avx(auVar235,auVar243);
                    auVar229._0_4_ = auVar235._0_4_ * auVar235._0_4_ + auVar206._0_4_;
                    auVar229._4_4_ = auVar235._4_4_ * auVar235._4_4_ + auVar206._4_4_;
                    auVar229._8_4_ = auVar235._8_4_ * auVar235._8_4_ + auVar206._8_4_;
                    auVar229._12_4_ = auVar235._12_4_ * auVar235._12_4_ + auVar206._12_4_;
                    auVar233._16_4_ = auVar235._16_4_ * auVar235._16_4_ + auVar206._16_4_;
                    auVar233._0_16_ = auVar229;
                    auVar233._20_4_ = auVar235._20_4_ * auVar235._20_4_ + auVar206._20_4_;
                    auVar233._24_4_ = auVar235._24_4_ * auVar235._24_4_ + auVar206._24_4_;
                    auVar233._28_4_ = auVar235._28_4_ + auVar206._28_4_;
                    auVar174 = ZEXT3264(_DAT_0054f040);
                    uVar27 = uVar27 + 8;
                    auVar194 = ZEXT3264(auVar233);
                  } while ((uVar20 + 8 & 0x1fffffff8) != uVar27);
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar106._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                  auVar106._12_4_ = auVar94._12_4_ ^ 0x80000000;
                  auVar114 = vpcmpgtq_avx(auVar106,auVar114);
                  auVar115 = vpackssdw_avx(auVar114,auVar167);
                  auVar114 = vorps_avx(auVar178,auVar176);
                  auVar131._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                  auVar131._8_4_ = auVar93._8_4_;
                  auVar131._12_4_ = auVar93._12_4_ ^ 0x80000000;
                  auVar114 = vpcmpgtq_avx(auVar131,auVar114);
                  auVar114 = vpackssdw_avx(auVar114,auVar135);
                  auVar114 = vblendvps_avx(auVar206._0_16_,auVar229,auVar114 ^ auVar134);
                  in_ZMM2 = ZEXT1664(auVar233._16_16_);
                  auVar115 = vblendvps_avx(auVar206._16_16_,auVar233._16_16_,auVar115 ^ auVar134);
                  auVar114 = vhaddps_avx(auVar115,auVar114);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  auVar114 = vhaddps_avx(auVar114,auVar114);
                  fVar96 = auVar114._0_4_;
                  auVar254 = ZEXT3264(auVar254._0_32_);
                }
                auVar114 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
                auVar83 = auVar254._0_32_;
                auVar189 = ZEXT1632(ZEXT816(0) << 0x40);
                if (iVar18 == 8) {
                  auVar189._0_4_ = auVar217._0_4_ * local_78;
                  auVar189._4_4_ = auVar217._4_4_ * fStack_74;
                  auVar189._8_4_ = auVar217._8_4_ * fStack_70;
                  auVar189._12_4_ = auVar217._12_4_ * fStack_6c;
                  auVar189._16_4_ = auVar217._16_4_ * local_78;
                  auVar189._20_4_ = auVar217._20_4_ * fStack_74;
                  auVar189._24_4_ = auVar217._24_4_ * fStack_70;
                  auVar189._28_4_ = 0;
                }
                if (iVar18 == 4) {
                  auVar222._0_4_ = auVar222._0_4_ + auVar217._0_4_ + auVar217._16_4_;
                  auVar222._4_4_ = fVar35 + auVar217._4_4_ + auVar217._20_4_;
                  auVar222._8_4_ = fVar98 + auVar217._8_4_ + auVar217._24_4_;
                  auVar222._12_4_ = fVar95 + auVar217._12_4_ + auVar217._28_4_;
                  auVar189 = vblendps_avx(auVar189,ZEXT1632(CONCAT412(auVar222._12_4_ * fStack_6c,
                                                                      CONCAT48(auVar222._8_4_ *
                                                                               fStack_70,
                                                                               CONCAT44(auVar222.
                                                  _4_4_ * fStack_74,auVar222._0_4_ * local_78)))),
                                          0xf);
                }
                if (iVar18 == 1) {
                  auVar115 = vshufpd_avx(auVar222,auVar222,1);
                  auVar107._0_4_ = auVar222._0_4_ + auVar115._0_4_;
                  auVar107._4_4_ = auVar222._4_4_ + auVar115._4_4_;
                  auVar107._8_4_ = auVar222._8_4_ + auVar115._8_4_;
                  auVar107._12_4_ = auVar222._12_4_ + auVar115._12_4_;
                  auVar115 = vhaddps_avx(auVar217._16_16_,auVar217._0_16_);
                  auVar178 = vmovshdup_avx(auVar107);
                  in_ZMM2 = ZEXT1664(auVar178);
                  auVar115 = vhaddps_avx(auVar115,auVar115);
                  auVar115 = vhaddps_avx(auVar115,auVar115);
                  auVar189 = vblendps_avx(auVar189,ZEXT432((uint)((fVar96 + auVar115._0_4_ +
                                                                   auVar107._0_4_ + auVar178._0_4_)
                                                                 * fVar34)),1);
                }
                fVar35 = auVar189._0_4_;
                auVar184 = auVar189._0_28_;
                fVar98 = auVar254._0_4_;
                if (iVar18 == 1) {
                  fVar35 = fVar35 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
                  auVar114 = vrsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
                  fVar95 = auVar114._0_4_;
                  fVar35 = fVar95 * -0.5 * (fVar35 * fVar95 * fVar95 + -3.0);
                  auVar93 = vblendps_avx(auVar189,ZEXT432((uint)fVar35),1);
                  auVar184 = auVar93._0_28_;
                  auVar83 = vblendps_avx(auVar83,ZEXT432((uint)(fVar35 * -fVar98)),1);
                }
                else if (iVar18 == 4) {
                  auVar114 = vshufps_avx(auVar114,auVar114,0);
                  auVar52._0_4_ = fVar35 + auVar114._0_4_;
                  auVar52._4_4_ = auVar189._4_4_ + auVar114._4_4_;
                  auVar52._8_4_ = auVar189._8_4_ + auVar114._8_4_;
                  auVar52._12_4_ = auVar189._12_4_ + auVar114._12_4_;
                  auVar114 = vrsqrtps_avx(auVar52);
                  fVar35 = auVar114._0_4_;
                  fVar95 = auVar114._4_4_;
                  fVar96 = auVar114._8_4_;
                  fVar97 = auVar114._12_4_;
                  in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
                  fVar35 = fVar35 * -0.5 * (auVar52._0_4_ * fVar35 * fVar35 + -3.0);
                  fVar95 = fVar95 * -0.5 * (auVar52._4_4_ * fVar95 * fVar95 + -3.0);
                  fVar96 = fVar96 * -0.5 * (auVar52._8_4_ * fVar96 * fVar96 + -3.0);
                  fVar97 = fVar97 * -0.5 * (auVar52._12_4_ * fVar97 * fVar97 + -3.0);
                  auVar93 = vblendps_avx(auVar189,ZEXT1632(CONCAT412(fVar97,CONCAT48(fVar96,CONCAT44
                                                  (fVar95,fVar35)))),0xf);
                  auVar184 = auVar93._0_28_;
                  auVar83 = vblendps_avx(auVar83,ZEXT1632(CONCAT412(fVar97 * -auVar254._12_4_,
                                                                    CONCAT48(fVar96 * -auVar254.
                                                  _8_4_,CONCAT44(fVar95 * -auVar254._4_4_,
                                                                 fVar35 * -fVar98)))),0xf);
                }
                else if (iVar18 == 8) {
                  auVar114 = vshufps_avx(auVar114,auVar114,0);
                  auVar80._0_4_ = fVar35 + auVar114._0_4_;
                  auVar80._4_4_ = auVar189._4_4_ + auVar114._4_4_;
                  auVar80._8_4_ = auVar189._8_4_ + auVar114._8_4_;
                  auVar80._12_4_ = auVar189._12_4_ + auVar114._12_4_;
                  auVar80._16_4_ = auVar189._16_4_ + auVar114._0_4_;
                  auVar80._20_4_ = auVar189._20_4_ + auVar114._4_4_;
                  auVar80._24_4_ = auVar189._24_4_ + auVar114._8_4_;
                  auVar80._28_4_ = auVar189._28_4_ + auVar114._12_4_;
                  auVar93 = vrsqrtps_avx(auVar80);
                  fVar35 = auVar93._0_4_;
                  fVar95 = auVar93._4_4_;
                  fVar96 = auVar93._8_4_;
                  fVar97 = auVar93._12_4_;
                  fVar207 = auVar93._16_4_;
                  fVar208 = auVar93._20_4_;
                  fVar209 = auVar93._24_4_;
                  in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                               CONCAT424(0xbf000000,
                                                         CONCAT420(0xbf000000,
                                                                   CONCAT416(0xbf000000,
                                                                             CONCAT412(0xbf000000,
                                                                                       CONCAT48(
                                                  0xbf000000,0xbf000000bf000000)))))));
                  auVar184._0_4_ = fVar35 * -0.5 * (auVar80._0_4_ * fVar35 * fVar35 + -3.0);
                  auVar184._4_4_ = fVar95 * -0.5 * (auVar80._4_4_ * fVar95 * fVar95 + -3.0);
                  auVar184._8_4_ = fVar96 * -0.5 * (auVar80._8_4_ * fVar96 * fVar96 + -3.0);
                  auVar184._12_4_ = fVar97 * -0.5 * (auVar80._12_4_ * fVar97 * fVar97 + -3.0);
                  auVar184._16_4_ = fVar207 * -0.5 * (auVar80._16_4_ * fVar207 * fVar207 + -3.0);
                  auVar184._20_4_ = fVar208 * -0.5 * (auVar80._20_4_ * fVar208 * fVar208 + -3.0);
                  auVar184._24_4_ = fVar209 * -0.5 * (auVar80._24_4_ * fVar209 * fVar209 + -3.0);
                  auVar205._0_4_ = auVar184._0_4_ * -fVar98;
                  auVar205._4_4_ = auVar184._4_4_ * -auVar254._4_4_;
                  auVar205._8_4_ = auVar184._8_4_ * -auVar254._8_4_;
                  auVar205._12_4_ = auVar184._12_4_ * -auVar254._12_4_;
                  auVar205._16_4_ = auVar184._16_4_ * -auVar254._16_4_;
                  auVar205._20_4_ = auVar184._20_4_ * -auVar254._20_4_;
                  auVar205._28_36_ = auVar254._28_36_;
                  auVar205._24_4_ = auVar184._24_4_ * -auVar254._24_4_;
                  auVar83 = auVar205._0_32_;
                }
                auVar114 = auVar184._0_16_;
                auVar115 = auVar83._0_16_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
                  auVar168 = auVar115;
                  auVar178 = auVar114;
                  if (iVar18 != 4) {
                    auVar178 = vshufps_avx(auVar114,auVar114,0);
                    auVar168 = vshufps_avx(auVar115,auVar115,0);
                  }
                  if (iVar18 != 8) {
                    auVar120._16_16_ = auVar178;
                    auVar120._0_16_ = auVar178;
                    auVar184 = auVar120._0_28_;
                    auVar83._16_16_ = auVar168;
                    auVar83._0_16_ = auVar168;
                  }
                  uVar19 = 0;
                  if (7 < (int)uVar28) {
                    iVar17 = 8;
                    do {
                      auVar141._0_4_ = auVar184._0_4_ * *(float *)*pauVar25 + auVar83._0_4_;
                      auVar141._4_4_ = auVar184._4_4_ * *(float *)(*pauVar25 + 4) + auVar83._4_4_;
                      auVar141._8_4_ = auVar184._8_4_ * *(float *)(*pauVar25 + 8) + auVar83._8_4_;
                      auVar141._12_4_ =
                           auVar184._12_4_ * *(float *)(*pauVar25 + 0xc) + auVar83._12_4_;
                      auVar141._16_4_ =
                           auVar184._16_4_ * *(float *)(*pauVar25 + 0x10) + auVar83._16_4_;
                      auVar141._20_4_ =
                           auVar184._20_4_ * *(float *)(*pauVar25 + 0x14) + auVar83._20_4_;
                      auVar141._24_4_ =
                           auVar184._24_4_ * *(float *)(*pauVar25 + 0x18) + auVar83._24_4_;
                      auVar141._28_4_ = in_ZMM2._28_4_ + auVar83._28_4_;
                      in_ZMM2 = ZEXT3264(auVar141);
                      *pauVar25 = auVar141;
                      pauVar25 = pauVar25 + 1;
                      iVar17 = iVar17 + 8;
                      uVar19 = uVar32;
                    } while (iVar17 <= (int)uVar28);
                  }
                  uVar26 = uVar19 | 4;
                  while ((int)uVar26 <= (int)uVar28) {
                    auVar55._0_4_ = auVar168._0_4_ + auVar178._0_4_ * *(float *)*pauVar25;
                    auVar55._4_4_ = auVar168._4_4_ + auVar178._4_4_ * *(float *)(*pauVar25 + 4);
                    auVar55._8_4_ = auVar168._8_4_ + auVar178._8_4_ * *(float *)(*pauVar25 + 8);
                    auVar55._12_4_ = auVar168._12_4_ + auVar178._12_4_ * *(float *)(*pauVar25 + 0xc)
                    ;
                    *(undefined1 (*) [16])*pauVar25 = auVar55;
                    pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
                    uVar26 = uVar19 + 8;
                    uVar19 = uVar19 + 4;
                  }
                  if ((int)uVar19 < (int)uVar28) {
                    uVar20 = CONCAT44(0,~uVar19 + uVar28);
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar20;
                    auVar178 = vpshufd_avx(auVar56,0x44);
                    auVar168 = vshufps_avx(auVar114,auVar114,0);
                    auVar69 = vshufps_avx(auVar115,auVar115,0);
                    auVar114 = vorps_avx(auVar178,auVar176);
                    in_ZMM2 = ZEXT1664(auVar114);
                    auVar115 = vorps_avx(auVar178,auVar176);
                    uVar27 = 0;
                    do {
                      auVar57._8_8_ = 0;
                      auVar57._0_8_ = uVar27;
                      auVar167 = vpshufd_avx(auVar57,0x44);
                      auVar84._16_16_ = auVar167;
                      auVar84._0_16_ = auVar167;
                      auVar93 = vorps_avx(auVar84,auVar174._0_32_);
                      auVar94 = vorps_avx(auVar84,_DAT_0054f060);
                      auVar167 = vorps_avx(auVar178,auVar176);
                      auVar161._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
                      auVar161._8_4_ = auVar94._24_4_;
                      auVar161._12_4_ = auVar94._28_4_ ^ 0x80000000;
                      auVar135 = vpcmpgtq_avx(auVar161,auVar167);
                      auVar58._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                      auVar58._8_4_ = auVar94._8_4_;
                      auVar58._12_4_ = auVar94._12_4_ ^ 0x80000000;
                      auVar152 = vpcmpgtq_avx(auVar58,auVar114);
                      auVar135 = vpackssdw_avx(auVar152,auVar135);
                      auVar162._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
                      auVar162._8_4_ = auVar93._24_4_;
                      auVar162._12_4_ = auVar93._28_4_ ^ 0x80000000;
                      auVar167 = vpcmpgtq_avx(auVar162,auVar167);
                      auVar174 = ZEXT3264(_DAT_0054f040);
                      auVar108._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                      auVar108._8_4_ = auVar93._8_4_;
                      auVar108._12_4_ = auVar93._12_4_ ^ 0x80000000;
                      auVar152 = vpcmpgtq_avx(auVar108,auVar115);
                      auVar167 = vpackssdw_avx(auVar152,auVar167);
                      auVar167 = vpackssdw_avx(auVar167 ^ auVar134,auVar135 ^ auVar134);
                      auVar135 = vpmovsxwd_avx(auVar167);
                      auVar167 = vpunpckhwd_avx(auVar167,auVar167);
                      auVar85._16_16_ = auVar167;
                      auVar85._0_16_ = auVar135;
                      auVar93 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                        (*pauVar25 + uVar27 * 4));
                      auVar121._0_4_ = auVar69._0_4_ + auVar93._0_4_ * auVar168._0_4_;
                      auVar121._4_4_ = auVar69._4_4_ + auVar93._4_4_ * auVar168._4_4_;
                      auVar121._8_4_ = auVar69._8_4_ + auVar93._8_4_ * auVar168._8_4_;
                      auVar121._12_4_ = auVar69._12_4_ + auVar93._12_4_ * auVar168._12_4_;
                      auVar121._16_4_ = auVar69._0_4_ + auVar93._16_4_ * auVar168._0_4_;
                      auVar121._20_4_ = auVar69._4_4_ + auVar93._20_4_ * auVar168._4_4_;
                      auVar121._24_4_ = auVar69._8_4_ + auVar93._24_4_ * auVar168._8_4_;
                      auVar121._28_4_ = auVar69._12_4_ + auVar93._28_4_;
                      auVar93 = vmaskmovps_avx(auVar85,auVar121);
                      *(undefined1 (*) [32])(*pauVar25 + uVar27 * 4) = auVar93;
                      uVar27 = uVar27 + 8;
                    } while ((uVar20 + 8 & 0x1fffffff8) != uVar27);
                  }
                }
                else {
                  fVar35 = auVar184._0_4_;
                  fVar98 = auVar184._4_4_;
                  fVar95 = auVar184._8_4_;
                  fVar96 = auVar184._12_4_;
                  fVar97 = auVar83._0_4_;
                  fVar207 = auVar83._4_4_;
                  fVar208 = auVar83._8_4_;
                  fVar209 = auVar83._12_4_;
                  pfVar16 = pfVar33;
                  pfVar29 = pfVar22;
                  if (7 < (int)uVar28 && iVar18 == 8) {
                    iVar17 = 8;
                    do {
                      fVar125 = *pfVar29;
                      fVar126 = *pfVar16;
                      fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
                      fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
                      fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
                      fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
                      fVar149 = auVar83._16_4_ + auVar184._16_4_ * *(float *)(*pauVar25 + 0x10);
                      fVar150 = auVar83._20_4_ + auVar184._20_4_ * *(float *)(*pauVar25 + 0x14);
                      fVar151 = auVar83._24_4_ + auVar184._24_4_ * *(float *)(*pauVar25 + 0x18);
                      in_ZMM2 = ZEXT3264(CONCAT428(auVar83._28_4_ + in_ZMM2._28_4_,
                                                   CONCAT424(fVar151,CONCAT420(fVar150,CONCAT416(
                                                  fVar149,CONCAT412(fVar148,CONCAT48(fVar147,
                                                  CONCAT44(fVar146,fVar127))))))));
                      auVar81._0_4_ = fVar125 * fVar127 + fVar126;
                      auVar81._4_4_ = fVar125 * fVar146 + fVar126;
                      auVar81._8_4_ = fVar125 * fVar147 + fVar126;
                      auVar81._12_4_ = fVar125 * fVar148 + fVar126;
                      auVar81._16_4_ = fVar125 * fVar149 + fVar126;
                      auVar81._20_4_ = fVar125 * fVar150 + fVar126;
                      auVar81._24_4_ = fVar125 * fVar151 + fVar126;
                      auVar81._28_4_ = fVar125 + fVar126;
                      *pauVar25 = auVar81;
                      pauVar25 = pauVar25 + 1;
                      pfVar29 = pfVar29 + 1;
                      pfVar16 = pfVar16 + 1;
                      iVar17 = iVar17 + 8;
                    } while (iVar17 <= (int)uVar28);
                  }
                  if (iVar18 == 4) {
                    uVar19 = 4;
                    if (7 < (int)uVar28) {
                      in_ZMM2 = ZEXT3264(CONCAT1616(auVar114,auVar114));
                      iVar17 = 8;
                      do {
                        fVar125 = *pfVar29;
                        fVar126 = pfVar29[1];
                        fVar127 = *pfVar16;
                        fVar146 = pfVar16[1];
                        auVar82._0_4_ = fVar127 + fVar125 * (fVar35 * *(float *)*pauVar25 + fVar97);
                        auVar82._4_4_ =
                             fVar127 + fVar125 * (fVar98 * *(float *)(*pauVar25 + 4) + fVar207);
                        auVar82._8_4_ =
                             fVar127 + fVar125 * (fVar95 * *(float *)(*pauVar25 + 8) + fVar208);
                        auVar82._12_4_ =
                             fVar127 + fVar125 * (fVar96 * *(float *)(*pauVar25 + 0xc) + fVar209);
                        auVar82._16_4_ =
                             fVar146 + fVar126 * (fVar35 * *(float *)(*pauVar25 + 0x10) + fVar97);
                        auVar82._20_4_ =
                             fVar146 + fVar126 * (fVar98 * *(float *)(*pauVar25 + 0x14) + fVar207);
                        auVar82._24_4_ =
                             fVar146 + fVar126 * (fVar95 * *(float *)(*pauVar25 + 0x18) + fVar208);
                        auVar82._28_4_ = fVar146 + fVar126;
                        *pauVar25 = auVar82;
                        pauVar25 = pauVar25 + 1;
                        pfVar29 = pfVar29 + 2;
                        pfVar16 = pfVar16 + 2;
                        iVar17 = iVar17 + 8;
                      } while (iVar17 <= (int)uVar28);
                      auVar174 = ZEXT3264(_DAT_0054f040);
                      uVar19 = uVar28 | 4;
                    }
                    for (; (int)uVar19 <= (int)uVar28; uVar19 = uVar19 + 4) {
                      fVar125 = *pfVar29;
                      fVar126 = *pfVar16;
                      fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
                      fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
                      fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
                      fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
                      in_ZMM2 = ZEXT1664(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar146,fVar127
                                                                                    ))));
                      auVar53._0_4_ = fVar125 * fVar127 + fVar126;
                      auVar53._4_4_ = fVar125 * fVar146 + fVar126;
                      auVar53._8_4_ = fVar125 * fVar147 + fVar126;
                      auVar53._12_4_ = fVar125 * fVar148 + fVar126;
                      *(undefined1 (*) [16])*pauVar25 = auVar53;
                      pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
                      pfVar29 = pfVar29 + 1;
                      pfVar16 = pfVar16 + 1;
                    }
                  }
                  if (iVar18 == 1) {
                    auVar114 = vshufps_avx(auVar114,auVar114,0);
                    auVar115 = vshufps_avx(auVar115,auVar115,0);
                    fVar98 = auVar114._0_4_;
                    fVar95 = auVar114._4_4_;
                    fVar96 = auVar114._8_4_;
                    fVar207 = auVar115._0_4_;
                    fVar208 = auVar115._4_4_;
                    fVar209 = auVar115._8_4_;
                    fVar125 = auVar115._12_4_;
                    uVar19 = 0;
                    if (7 < (int)uVar28) {
                      iVar17 = 8;
                      do {
                        auVar140._0_4_ =
                             (fVar98 * *(float *)*pauVar25 + fVar207) * *pfVar29 + *pfVar16;
                        auVar140._4_4_ =
                             (fVar95 * *(float *)(*pauVar25 + 4) + fVar208) * pfVar29[1] +
                             pfVar16[1];
                        auVar140._8_4_ =
                             (fVar96 * *(float *)(*pauVar25 + 8) + fVar209) * pfVar29[2] +
                             pfVar16[2];
                        auVar140._12_4_ =
                             (auVar114._12_4_ * *(float *)(*pauVar25 + 0xc) + fVar125) * pfVar29[3]
                             + pfVar16[3];
                        auVar140._16_4_ =
                             (fVar98 * *(float *)(*pauVar25 + 0x10) + fVar207) * pfVar29[4] +
                             pfVar16[4];
                        auVar140._20_4_ =
                             (fVar95 * *(float *)(*pauVar25 + 0x14) + fVar208) * pfVar29[5] +
                             pfVar16[5];
                        auVar140._24_4_ =
                             (fVar96 * *(float *)(*pauVar25 + 0x18) + fVar209) * pfVar29[6] +
                             pfVar16[6];
                        auVar140._28_4_ = in_ZMM2._28_4_ + fVar125 + pfVar16[7];
                        in_ZMM2 = ZEXT3264(auVar140);
                        *pauVar25 = auVar140;
                        pauVar25 = pauVar25 + 1;
                        pfVar29 = pfVar29 + 8;
                        pfVar16 = pfVar16 + 8;
                        iVar17 = iVar17 + 8;
                        uVar19 = uVar32;
                      } while (iVar17 <= (int)uVar28);
                    }
                    uVar26 = uVar19 | 4;
                    while ((int)uVar26 <= (int)uVar28) {
                      auVar54._0_4_ = (fVar207 + fVar98 * *(float *)*pauVar25) * *pfVar29 + *pfVar16
                      ;
                      auVar54._4_4_ =
                           (fVar208 + fVar95 * *(float *)(*pauVar25 + 4)) * pfVar29[1] + pfVar16[1];
                      auVar54._8_4_ =
                           (fVar209 + fVar96 * *(float *)(*pauVar25 + 8)) * pfVar29[2] + pfVar16[2];
                      auVar54._12_4_ =
                           (fVar125 + auVar114._12_4_ * *(float *)(*pauVar25 + 0xc)) * pfVar29[3] +
                           pfVar16[3];
                      *(undefined1 (*) [16])*pauVar25 = auVar54;
                      pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
                      pfVar29 = pfVar29 + 4;
                      pfVar16 = pfVar16 + 4;
                      uVar26 = uVar19 + 8;
                      uVar19 = uVar19 + 4;
                    }
                    if (uVar28 - uVar19 != 0 && (int)uVar19 <= (int)uVar28) {
                      lVar21 = 0;
                      do {
                        *(float *)(*pauVar25 + lVar21 * 4) =
                             (fVar97 + fVar35 * *(float *)(*pauVar25 + lVar21 * 4)) *
                             pfVar29[lVar21] + pfVar16[lVar21];
                        lVar21 = lVar21 + 1;
                      } while (uVar28 - uVar19 != (int)lVar21);
                    }
                  }
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar24);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar23);
        }
      }
      else if (0 < (int)uVar23) {
        pp_Var2 = this->_vptr_LayerNorm_x86_avx;
        uVar28 = uVar24 * iVar1 * iVar18;
        fVar34 = 1.0 / (float)(int)(uVar24 * iVar1);
        auVar153 = vshufps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),0);
        uVar24 = uVar28 & 0xfffffff8;
        uVar30 = 0;
        auVar174 = ZEXT3264(_DAT_0054f040);
        auVar177._8_8_ = 0x8000000000000000;
        auVar177._0_8_ = 0x8000000000000000;
        auVar134 = vpcmpeqd_avx(auVar114,auVar114);
        do {
          pauVar25 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar30 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar190 = ZEXT832(0) << 0x40;
          pauVar15 = pauVar25;
          uVar32 = 0;
          if (7 < (int)uVar28) {
            iVar17 = 8;
            do {
              auVar190._0_4_ = auVar254._0_4_ + *(float *)*pauVar15;
              auVar190._4_4_ = auVar254._4_4_ + *(float *)(*pauVar15 + 4);
              auVar190._8_4_ = auVar254._8_4_ + *(float *)(*pauVar15 + 8);
              auVar190._12_4_ = auVar254._12_4_ + *(float *)(*pauVar15 + 0xc);
              auVar190._16_4_ = auVar254._16_4_ + *(float *)(*pauVar15 + 0x10);
              auVar190._20_4_ = auVar254._20_4_ + *(float *)(*pauVar15 + 0x14);
              auVar190._24_4_ = auVar254._24_4_ + *(float *)(*pauVar15 + 0x18);
              auVar190._28_4_ = auVar254._28_4_ + *(float *)(*pauVar15 + 0x1c);
              auVar254 = ZEXT3264(auVar190);
              pauVar15 = pauVar15 + 1;
              iVar17 = iVar17 + 8;
              uVar32 = uVar24;
            } while (iVar17 <= (int)uVar28);
          }
          uVar19 = uVar32 | 4;
          auVar197 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar35 = auVar197._4_4_;
            fVar98 = auVar197._8_4_;
            fVar95 = auVar197._12_4_;
            if ((int)uVar28 < (int)uVar19) break;
            auVar197._0_4_ = auVar197._0_4_ + *(float *)*pauVar15;
            auVar197._4_4_ = fVar35 + *(float *)(*pauVar15 + 4);
            auVar197._8_4_ = fVar98 + *(float *)(*pauVar15 + 8);
            auVar197._12_4_ = fVar95 + *(float *)(*pauVar15 + 0xc);
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
            uVar19 = uVar32 + 8;
            uVar32 = uVar32 + 4;
          }
          fVar96 = 0.0;
          if ((int)uVar32 < (int)uVar28) {
            uVar31 = CONCAT44(0,~uVar32 + uVar28);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar31;
            auVar178 = vpshufd_avx(auVar59,0x44);
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar115 = vorps_avx(auVar178,auVar177);
            uVar20 = 0;
            auVar254 = ZEXT464(0) << 0x40;
            do {
              auVar194 = auVar254;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar20;
              auVar168 = vpshufd_avx(auVar60,0x44);
              auVar86._16_16_ = auVar168;
              auVar86._0_16_ = auVar168;
              auVar93 = vorps_avx(auVar86,auVar174._0_32_);
              auVar94 = vorps_avx(_DAT_0054f060,auVar86);
              auVar168 = vorps_avx(auVar178,auVar177);
              auVar61._8_4_ = auVar94._24_4_;
              auVar61._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
              auVar61._12_4_ = auVar94._28_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar61,auVar168);
              auVar109._8_4_ = auVar94._8_4_;
              auVar238._8_4_ = auVar109._8_4_;
              auVar238._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
              auVar238._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar238,auVar114);
              auVar69 = vpackssdw_avx(auVar69,auVar167);
              auVar250._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
              auVar250._8_4_ = auVar93._24_4_;
              auVar250._12_4_ = auVar93._28_4_ ^ 0x80000000;
              auVar135 = vpcmpgtq_avx(auVar250,auVar168);
              auVar251._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
              auVar251._8_4_ = auVar93._8_4_;
              auVar251._12_4_ = auVar93._12_4_ ^ 0x80000000;
              auVar168 = vpcmpgtq_avx(auVar251,auVar115);
              auVar168 = vpackssdw_avx(auVar168,auVar135);
              auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
              auVar69 = vpmovsxwd_avx(auVar168);
              auVar168 = vpunpckhwd_avx(auVar168,auVar168);
              auVar244._16_16_ = auVar168;
              auVar244._0_16_ = auVar69;
              auVar235 = vmaskmovps_avx(auVar244,*(undefined1 (*) [32])(*pauVar15 + uVar20 * 4));
              auVar212._0_4_ = auVar235._0_4_ + auVar194._0_4_;
              auVar212._4_4_ = auVar235._4_4_ + auVar194._4_4_;
              auVar212._8_4_ = auVar235._8_4_ + auVar194._8_4_;
              auVar212._12_4_ = auVar235._12_4_ + auVar194._12_4_;
              auVar218._16_4_ = auVar235._16_4_ + auVar194._16_4_;
              auVar218._0_16_ = auVar212;
              auVar218._20_4_ = auVar235._20_4_ + auVar194._20_4_;
              auVar218._24_4_ = auVar235._24_4_ + auVar194._24_4_;
              auVar218._28_4_ = auVar235._28_4_ + auVar194._28_4_;
              uVar20 = uVar20 + 8;
              auVar254 = ZEXT3264(auVar218);
            } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar109._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
            auVar109._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar109,auVar114);
            auVar115 = vpackssdw_avx(auVar114,auVar167);
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar132._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
            auVar132._8_4_ = auVar93._8_4_;
            auVar132._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar132,auVar114);
            auVar114 = vpackssdw_avx(auVar114,auVar135);
            auVar114 = vblendvps_avx(auVar194._0_16_,auVar212,auVar114 ^ auVar134);
            in_ZMM2 = ZEXT1664(auVar218._16_16_);
            auVar115 = vblendvps_avx(auVar194._16_16_,auVar218._16_16_,auVar115 ^ auVar134);
            auVar114 = vhaddps_avx(auVar115,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            fVar96 = auVar114._0_4_;
          }
          local_78 = auVar153._0_4_;
          fStack_74 = auVar153._4_4_;
          fStack_70 = auVar153._8_4_;
          fStack_6c = auVar153._12_4_;
          if (iVar18 == 4) {
            auVar197._0_4_ = auVar197._0_4_ + auVar190._16_4_ + auVar190._0_4_;
            auVar197._4_4_ = fVar35 + auVar190._20_4_ + auVar190._4_4_;
            auVar197._8_4_ = fVar98 + auVar190._24_4_ + auVar190._8_4_;
            auVar197._12_4_ = fVar95 + auVar190._28_4_ + auVar190._12_4_;
            auVar254 = ZEXT1664(CONCAT412(auVar197._12_4_ * fStack_6c,
                                          CONCAT48(auVar197._8_4_ * fStack_70,
                                                   CONCAT44(auVar197._4_4_ * fStack_74,
                                                            auVar197._0_4_ * local_78))));
          }
          else {
            auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
            if (iVar18 == 8) {
              auVar254 = ZEXT2864(CONCAT424(auVar190._24_4_ * fStack_70,
                                            CONCAT420(auVar190._20_4_ * fStack_74,
                                                      CONCAT416(auVar190._16_4_ * local_78,
                                                                CONCAT412(auVar190._12_4_ *
                                                                          fStack_6c,
                                                                          CONCAT48(auVar190._8_4_ *
                                                                                   fStack_70,
                                                                                   CONCAT44(auVar190
                                                  ._4_4_ * fStack_74,auVar190._0_4_ * local_78))))))
                                 );
            }
          }
          if (iVar18 == 1) {
            auVar114 = vshufpd_avx(auVar197,auVar197,1);
            auVar110._0_4_ = auVar197._0_4_ + auVar114._0_4_;
            auVar110._4_4_ = auVar197._4_4_ + auVar114._4_4_;
            auVar110._8_4_ = auVar197._8_4_ + auVar114._8_4_;
            auVar110._12_4_ = auVar197._12_4_ + auVar114._12_4_;
            auVar114 = vhaddps_avx(auVar190._16_16_,auVar190._0_16_);
            auVar115 = vmovshdup_avx(auVar110);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            fVar96 = fVar96 + auVar115._0_4_;
            in_ZMM2 = ZEXT464((uint)fVar96);
            auVar93 = vblendps_avx(auVar254._0_32_,
                                   ZEXT432((uint)((auVar114._0_4_ + auVar110._0_4_ + fVar96) *
                                                 fVar34)),1);
            auVar254 = ZEXT3264(auVar93);
          }
          auVar115 = auVar254._0_16_;
          auVar114 = auVar115;
          if (iVar18 != 4) {
            auVar114 = vshufps_avx(auVar115,auVar115,0);
          }
          auVar87 = auVar254._0_32_;
          if (iVar18 != 8) {
            auVar87._16_16_ = auVar114;
            auVar87._0_16_ = auVar114;
          }
          pauVar15 = pauVar25;
          if ((int)uVar28 < 8) {
            auVar219 = SUB6432(ZEXT864(0),0) << 0x20;
            uVar32 = 0;
          }
          else {
            auVar194 = ZEXT864(0) << 0x20;
            iVar17 = 8;
            do {
              auVar93 = vsubps_avx(*pauVar15,auVar87);
              auVar219._0_4_ = auVar194._0_4_ + auVar93._0_4_ * auVar93._0_4_;
              auVar219._4_4_ = auVar194._4_4_ + auVar93._4_4_ * auVar93._4_4_;
              auVar219._8_4_ = auVar194._8_4_ + auVar93._8_4_ * auVar93._8_4_;
              auVar219._12_4_ = auVar194._12_4_ + auVar93._12_4_ * auVar93._12_4_;
              auVar219._16_4_ = auVar194._16_4_ + auVar93._16_4_ * auVar93._16_4_;
              auVar219._20_4_ = auVar194._20_4_ + auVar93._20_4_ * auVar93._20_4_;
              auVar219._24_4_ = auVar194._24_4_ + auVar93._24_4_ * auVar93._24_4_;
              auVar219._28_4_ = auVar194._28_4_ + auVar93._28_4_;
              auVar194 = ZEXT3264(auVar219);
              pauVar15 = pauVar15 + 1;
              iVar17 = iVar17 + 8;
              uVar32 = uVar24;
            } while (iVar17 <= (int)uVar28);
          }
          uVar19 = uVar32 | 4;
          auVar223 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar35 = auVar223._4_4_;
            fVar98 = auVar223._8_4_;
            fVar95 = auVar223._12_4_;
            if ((int)uVar28 < (int)uVar19) break;
            auVar178 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar114);
            auVar223._0_4_ = auVar223._0_4_ + auVar178._0_4_ * auVar178._0_4_;
            auVar223._4_4_ = fVar35 + auVar178._4_4_ * auVar178._4_4_;
            auVar223._8_4_ = fVar98 + auVar178._8_4_ * auVar178._8_4_;
            auVar223._12_4_ = fVar95 + auVar178._12_4_ * auVar178._12_4_;
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
            uVar19 = uVar32 + 8;
            uVar32 = uVar32 + 4;
          }
          fVar96 = 0.0;
          if ((int)uVar32 < (int)uVar28) {
            uVar31 = CONCAT44(0,~uVar32 + uVar28);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar31;
            auVar178 = vpshufd_avx(auVar62,0x44);
            auVar114 = vshufps_avx(auVar115,auVar115,0);
            auVar245._16_16_ = auVar114;
            auVar245._0_16_ = auVar114;
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar115 = vorps_avx(auVar178,auVar177);
            uVar20 = 0;
            auVar194 = ZEXT464(0) << 0x40;
            do {
              auVar206 = auVar194;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar20;
              auVar168 = vpshufd_avx(auVar63,0x44);
              auVar88._16_16_ = auVar168;
              auVar88._0_16_ = auVar168;
              auVar93 = vorps_avx(auVar88,auVar174._0_32_);
              auVar94 = vorps_avx(_DAT_0054f060,auVar88);
              auVar168 = vorps_avx(auVar178,auVar177);
              auVar64._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
              auVar64._8_4_ = auVar94._24_4_;
              auVar64._12_4_ = auVar94._28_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar64,auVar168);
              auVar230._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
              auVar111._8_4_ = auVar94._8_4_;
              auVar230._8_4_ = auVar111._8_4_;
              auVar230._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar230,auVar114);
              auVar69 = vpackssdw_avx(auVar69,auVar167);
              auVar163._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
              auVar163._8_4_ = auVar93._24_4_;
              auVar163._12_4_ = auVar93._28_4_ ^ 0x80000000;
              auVar135 = vpcmpgtq_avx(auVar163,auVar168);
              auVar164._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
              auVar164._8_4_ = auVar93._8_4_;
              auVar164._12_4_ = auVar93._12_4_ ^ 0x80000000;
              auVar168 = vpcmpgtq_avx(auVar164,auVar115);
              auVar168 = vpackssdw_avx(auVar168,auVar135);
              auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
              auVar69 = vpmovsxwd_avx(auVar168);
              auVar168 = vpunpckhwd_avx(auVar168,auVar168);
              auVar173._16_16_ = auVar168;
              auVar173._0_16_ = auVar69;
              auVar235 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])(*pauVar15 + uVar20 * 4));
              auVar235 = vsubps_avx(auVar235,auVar245);
              auVar231._0_4_ = auVar235._0_4_ * auVar235._0_4_ + auVar206._0_4_;
              auVar231._4_4_ = auVar235._4_4_ * auVar235._4_4_ + auVar206._4_4_;
              auVar231._8_4_ = auVar235._8_4_ * auVar235._8_4_ + auVar206._8_4_;
              auVar231._12_4_ = auVar235._12_4_ * auVar235._12_4_ + auVar206._12_4_;
              auVar234._16_4_ = auVar235._16_4_ * auVar235._16_4_ + auVar206._16_4_;
              auVar234._0_16_ = auVar231;
              auVar234._20_4_ = auVar235._20_4_ * auVar235._20_4_ + auVar206._20_4_;
              auVar234._24_4_ = auVar235._24_4_ * auVar235._24_4_ + auVar206._24_4_;
              auVar234._28_4_ = auVar235._28_4_ + auVar206._28_4_;
              auVar174 = ZEXT3264(_DAT_0054f040);
              uVar20 = uVar20 + 8;
              auVar194 = ZEXT3264(auVar234);
            } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar111._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
            auVar111._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar111,auVar114);
            auVar115 = vpackssdw_avx(auVar114,auVar167);
            auVar114 = vorps_avx(auVar178,auVar177);
            auVar133._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
            auVar133._8_4_ = auVar93._8_4_;
            auVar133._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar133,auVar114);
            auVar114 = vpackssdw_avx(auVar114,auVar135);
            auVar114 = vblendvps_avx(auVar206._0_16_,auVar231,auVar114 ^ auVar134);
            in_ZMM2 = ZEXT1664(auVar234._16_16_);
            auVar115 = vblendvps_avx(auVar206._16_16_,auVar234._16_16_,auVar115 ^ auVar134);
            auVar114 = vhaddps_avx(auVar115,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            fVar96 = auVar114._0_4_;
            auVar254 = ZEXT3264(auVar254._0_32_);
          }
          auVar114 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
          auVar90 = auVar254._0_32_;
          auVar191 = ZEXT1632(ZEXT816(0) << 0x40);
          if (iVar18 == 8) {
            auVar191._0_4_ = auVar219._0_4_ * local_78;
            auVar191._4_4_ = auVar219._4_4_ * fStack_74;
            auVar191._8_4_ = auVar219._8_4_ * fStack_70;
            auVar191._12_4_ = auVar219._12_4_ * fStack_6c;
            auVar191._16_4_ = auVar219._16_4_ * local_78;
            auVar191._20_4_ = auVar219._20_4_ * fStack_74;
            auVar191._24_4_ = auVar219._24_4_ * fStack_70;
            auVar191._28_4_ = 0;
          }
          if (iVar18 == 4) {
            auVar223._0_4_ = auVar223._0_4_ + auVar219._0_4_ + auVar219._16_4_;
            auVar223._4_4_ = fVar35 + auVar219._4_4_ + auVar219._20_4_;
            auVar223._8_4_ = fVar98 + auVar219._8_4_ + auVar219._24_4_;
            auVar223._12_4_ = fVar95 + auVar219._12_4_ + auVar219._28_4_;
            auVar191 = vblendps_avx(auVar191,ZEXT1632(CONCAT412(auVar223._12_4_ * fStack_6c,
                                                                CONCAT48(auVar223._8_4_ * fStack_70,
                                                                         CONCAT44(auVar223._4_4_ *
                                                                                  fStack_74,
                                                                                  auVar223._0_4_ *
                                                                                  local_78)))),0xf);
          }
          if (iVar18 == 1) {
            auVar115 = vshufpd_avx(auVar223,auVar223,1);
            auVar112._0_4_ = auVar223._0_4_ + auVar115._0_4_;
            auVar112._4_4_ = auVar223._4_4_ + auVar115._4_4_;
            auVar112._8_4_ = auVar223._8_4_ + auVar115._8_4_;
            auVar112._12_4_ = auVar223._12_4_ + auVar115._12_4_;
            auVar115 = vhaddps_avx(auVar219._16_16_,auVar219._0_16_);
            auVar178 = vmovshdup_avx(auVar112);
            in_ZMM2 = ZEXT1664(auVar178);
            auVar115 = vhaddps_avx(auVar115,auVar115);
            auVar115 = vhaddps_avx(auVar115,auVar115);
            auVar191 = vblendps_avx(auVar191,ZEXT432((uint)((fVar96 + auVar115._0_4_ +
                                                             auVar112._0_4_ + auVar178._0_4_) *
                                                           fVar34)),1);
          }
          fVar35 = auVar191._0_4_;
          auVar185 = auVar191._0_28_;
          fVar98 = auVar254._0_4_;
          if (iVar18 == 1) {
            fVar35 = fVar35 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            auVar114 = vrsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
            fVar95 = auVar114._0_4_;
            fVar35 = fVar95 * -0.5 * (fVar35 * fVar95 * fVar95 + -3.0);
            auVar93 = vblendps_avx(auVar191,ZEXT432((uint)fVar35),1);
            auVar185 = auVar93._0_28_;
            auVar90 = vblendps_avx(auVar90,ZEXT432((uint)(fVar35 * -fVar98)),1);
          }
          else if (iVar18 == 4) {
            auVar114 = vshufps_avx(auVar114,auVar114,0);
            auVar65._0_4_ = fVar35 + auVar114._0_4_;
            auVar65._4_4_ = auVar191._4_4_ + auVar114._4_4_;
            auVar65._8_4_ = auVar191._8_4_ + auVar114._8_4_;
            auVar65._12_4_ = auVar191._12_4_ + auVar114._12_4_;
            auVar114 = vrsqrtps_avx(auVar65);
            fVar35 = auVar114._0_4_;
            fVar95 = auVar114._4_4_;
            fVar96 = auVar114._8_4_;
            fVar97 = auVar114._12_4_;
            in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
            fVar35 = fVar35 * -0.5 * (auVar65._0_4_ * fVar35 * fVar35 + -3.0);
            fVar95 = fVar95 * -0.5 * (auVar65._4_4_ * fVar95 * fVar95 + -3.0);
            fVar96 = fVar96 * -0.5 * (auVar65._8_4_ * fVar96 * fVar96 + -3.0);
            fVar97 = fVar97 * -0.5 * (auVar65._12_4_ * fVar97 * fVar97 + -3.0);
            auVar93 = vblendps_avx(auVar191,ZEXT1632(CONCAT412(fVar97,CONCAT48(fVar96,CONCAT44(
                                                  fVar95,fVar35)))),0xf);
            auVar185 = auVar93._0_28_;
            auVar90 = vblendps_avx(auVar90,ZEXT1632(CONCAT412(fVar97 * -auVar254._12_4_,
                                                              CONCAT48(fVar96 * -auVar254._8_4_,
                                                                       CONCAT44(fVar95 * -auVar254.
                                                  _4_4_,fVar35 * -fVar98)))),0xf);
          }
          else if (iVar18 == 8) {
            auVar114 = vshufps_avx(auVar114,auVar114,0);
            auVar89._0_4_ = fVar35 + auVar114._0_4_;
            auVar89._4_4_ = auVar191._4_4_ + auVar114._4_4_;
            auVar89._8_4_ = auVar191._8_4_ + auVar114._8_4_;
            auVar89._12_4_ = auVar191._12_4_ + auVar114._12_4_;
            auVar89._16_4_ = auVar191._16_4_ + auVar114._0_4_;
            auVar89._20_4_ = auVar191._20_4_ + auVar114._4_4_;
            auVar89._24_4_ = auVar191._24_4_ + auVar114._8_4_;
            auVar89._28_4_ = auVar191._28_4_ + auVar114._12_4_;
            auVar93 = vrsqrtps_avx(auVar89);
            fVar35 = auVar93._0_4_;
            fVar95 = auVar93._4_4_;
            fVar96 = auVar93._8_4_;
            fVar97 = auVar93._12_4_;
            fVar207 = auVar93._16_4_;
            fVar208 = auVar93._20_4_;
            fVar209 = auVar93._24_4_;
            in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                         CONCAT424(0xbf000000,
                                                   CONCAT420(0xbf000000,
                                                             CONCAT416(0xbf000000,
                                                                       CONCAT412(0xbf000000,
                                                                                 CONCAT48(0xbf000000
                                                                                          ,
                                                  0xbf000000bf000000)))))));
            auVar185._0_4_ = fVar35 * -0.5 * (auVar89._0_4_ * fVar35 * fVar35 + -3.0);
            auVar185._4_4_ = fVar95 * -0.5 * (auVar89._4_4_ * fVar95 * fVar95 + -3.0);
            auVar185._8_4_ = fVar96 * -0.5 * (auVar89._8_4_ * fVar96 * fVar96 + -3.0);
            auVar185._12_4_ = fVar97 * -0.5 * (auVar89._12_4_ * fVar97 * fVar97 + -3.0);
            auVar185._16_4_ = fVar207 * -0.5 * (auVar89._16_4_ * fVar207 * fVar207 + -3.0);
            auVar185._20_4_ = fVar208 * -0.5 * (auVar89._20_4_ * fVar208 * fVar208 + -3.0);
            auVar185._24_4_ = fVar209 * -0.5 * (auVar89._24_4_ * fVar209 * fVar209 + -3.0);
            auVar206._0_4_ = auVar185._0_4_ * -fVar98;
            auVar206._4_4_ = auVar185._4_4_ * -auVar254._4_4_;
            auVar206._8_4_ = auVar185._8_4_ * -auVar254._8_4_;
            auVar206._12_4_ = auVar185._12_4_ * -auVar254._12_4_;
            auVar206._16_4_ = auVar185._16_4_ * -auVar254._16_4_;
            auVar206._20_4_ = auVar185._20_4_ * -auVar254._20_4_;
            auVar206._28_36_ = auVar254._28_36_;
            auVar206._24_4_ = auVar185._24_4_ * -auVar254._24_4_;
            auVar90 = auVar206._0_32_;
          }
          auVar114 = auVar185._0_16_;
          auVar115 = auVar90._0_16_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            auVar168 = auVar115;
            auVar178 = auVar114;
            if (iVar18 != 4) {
              auVar178 = vshufps_avx(auVar114,auVar114,0);
              auVar168 = vshufps_avx(auVar115,auVar115,0);
            }
            if (iVar18 != 8) {
              auVar122._16_16_ = auVar178;
              auVar122._0_16_ = auVar178;
              auVar185 = auVar122._0_28_;
              auVar90._16_16_ = auVar168;
              auVar90._0_16_ = auVar168;
            }
            uVar32 = 0;
            if (7 < (int)uVar28) {
              iVar17 = 8;
              do {
                auVar143._0_4_ = auVar185._0_4_ * *(float *)*pauVar25 + auVar90._0_4_;
                auVar143._4_4_ = auVar185._4_4_ * *(float *)(*pauVar25 + 4) + auVar90._4_4_;
                auVar143._8_4_ = auVar185._8_4_ * *(float *)(*pauVar25 + 8) + auVar90._8_4_;
                auVar143._12_4_ = auVar185._12_4_ * *(float *)(*pauVar25 + 0xc) + auVar90._12_4_;
                auVar143._16_4_ = auVar185._16_4_ * *(float *)(*pauVar25 + 0x10) + auVar90._16_4_;
                auVar143._20_4_ = auVar185._20_4_ * *(float *)(*pauVar25 + 0x14) + auVar90._20_4_;
                auVar143._24_4_ = auVar185._24_4_ * *(float *)(*pauVar25 + 0x18) + auVar90._24_4_;
                auVar143._28_4_ = in_ZMM2._28_4_ + auVar90._28_4_;
                in_ZMM2 = ZEXT3264(auVar143);
                *pauVar25 = auVar143;
                pauVar25 = pauVar25 + 1;
                iVar17 = iVar17 + 8;
                uVar32 = uVar24;
              } while (iVar17 <= (int)uVar28);
            }
            uVar19 = uVar32 | 4;
            while ((int)uVar19 <= (int)uVar28) {
              fVar35 = *(float *)(*pauVar25 + 4);
              fVar98 = *(float *)(*pauVar25 + 8);
              fVar95 = *(float *)(*pauVar25 + 0xc);
              *(float *)*pauVar25 = auVar168._0_4_ + auVar178._0_4_ * *(float *)*pauVar25;
              *(float *)(*pauVar25 + 4) = auVar168._4_4_ + auVar178._4_4_ * fVar35;
              *(float *)(*pauVar25 + 8) = auVar168._8_4_ + auVar178._8_4_ * fVar98;
              *(float *)(*pauVar25 + 0xc) = auVar168._12_4_ + auVar178._12_4_ * fVar95;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              uVar19 = uVar32 + 8;
              uVar32 = uVar32 + 4;
            }
            if ((int)uVar32 < (int)uVar28) {
              uVar31 = CONCAT44(0,~uVar32 + uVar28);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = uVar31;
              auVar178 = vpshufd_avx(auVar66,0x44);
              auVar168 = vshufps_avx(auVar114,auVar114,0);
              auVar69 = vshufps_avx(auVar115,auVar115,0);
              auVar114 = vorps_avx(auVar178,auVar177);
              in_ZMM2 = ZEXT1664(auVar114);
              auVar115 = vorps_avx(auVar178,auVar177);
              uVar20 = 0;
              do {
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar20;
                auVar167 = vpshufd_avx(auVar67,0x44);
                auVar91._16_16_ = auVar167;
                auVar91._0_16_ = auVar167;
                auVar93 = vorps_avx(auVar91,auVar174._0_32_);
                auVar94 = vorps_avx(auVar91,_DAT_0054f060);
                auVar167 = vorps_avx(auVar178,auVar177);
                auVar165._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
                auVar165._8_4_ = auVar94._24_4_;
                auVar165._12_4_ = auVar94._28_4_ ^ 0x80000000;
                auVar135 = vpcmpgtq_avx(auVar165,auVar167);
                auVar68._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
                auVar68._8_4_ = auVar94._8_4_;
                auVar68._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar152 = vpcmpgtq_avx(auVar68,auVar114);
                auVar135 = vpackssdw_avx(auVar152,auVar135);
                auVar166._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
                auVar166._8_4_ = auVar93._24_4_;
                auVar166._12_4_ = auVar93._28_4_ ^ 0x80000000;
                auVar167 = vpcmpgtq_avx(auVar166,auVar167);
                auVar174 = ZEXT3264(_DAT_0054f040);
                auVar113._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
                auVar113._8_4_ = auVar93._8_4_;
                auVar113._12_4_ = auVar93._12_4_ ^ 0x80000000;
                auVar152 = vpcmpgtq_avx(auVar113,auVar115);
                auVar167 = vpackssdw_avx(auVar152,auVar167);
                auVar167 = vpackssdw_avx(auVar167 ^ auVar134,auVar135 ^ auVar134);
                auVar135 = vpmovsxwd_avx(auVar167);
                auVar167 = vpunpckhwd_avx(auVar167,auVar167);
                auVar92._16_16_ = auVar167;
                auVar92._0_16_ = auVar135;
                auVar93 = vmaskmovps_avx(auVar92,*(undefined1 (*) [32])(*pauVar25 + uVar20 * 4));
                auVar123._0_4_ = auVar69._0_4_ + auVar93._0_4_ * auVar168._0_4_;
                auVar123._4_4_ = auVar69._4_4_ + auVar93._4_4_ * auVar168._4_4_;
                auVar123._8_4_ = auVar69._8_4_ + auVar93._8_4_ * auVar168._8_4_;
                auVar123._12_4_ = auVar69._12_4_ + auVar93._12_4_ * auVar168._12_4_;
                auVar123._16_4_ = auVar69._0_4_ + auVar93._16_4_ * auVar168._0_4_;
                auVar123._20_4_ = auVar69._4_4_ + auVar93._20_4_ * auVar168._4_4_;
                auVar123._24_4_ = auVar69._8_4_ + auVar93._24_4_ * auVar168._8_4_;
                auVar123._28_4_ = auVar69._12_4_ + auVar93._28_4_;
                auVar93 = vmaskmovps_avx(auVar92,auVar123);
                *(undefined1 (*) [32])(*pauVar25 + uVar20 * 4) = auVar93;
                uVar20 = uVar20 + 8;
              } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
            }
          }
          else {
            fVar35 = auVar185._0_4_;
            fVar98 = auVar185._4_4_;
            fVar95 = auVar185._8_4_;
            fVar96 = auVar185._12_4_;
            fVar97 = auVar90._0_4_;
            fVar207 = auVar90._4_4_;
            fVar208 = auVar90._8_4_;
            fVar209 = auVar90._12_4_;
            pfVar16 = pfVar33;
            pfVar29 = pfVar22;
            if (7 < (int)uVar28 && iVar18 == 8) {
              iVar17 = 8;
              do {
                fVar125 = *pfVar29;
                fVar126 = *pfVar16;
                fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
                fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
                fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
                fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
                fVar149 = auVar90._16_4_ + auVar185._16_4_ * *(float *)(*pauVar25 + 0x10);
                fVar150 = auVar90._20_4_ + auVar185._20_4_ * *(float *)(*pauVar25 + 0x14);
                fVar151 = auVar90._24_4_ + auVar185._24_4_ * *(float *)(*pauVar25 + 0x18);
                in_ZMM2 = ZEXT3264(CONCAT428(auVar90._28_4_ + in_ZMM2._28_4_,
                                             CONCAT424(fVar151,CONCAT420(fVar150,CONCAT416(fVar149,
                                                  CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(
                                                  fVar146,fVar127))))))));
                *(float *)*pauVar25 = fVar125 * fVar127 + fVar126;
                *(float *)(*pauVar25 + 4) = fVar125 * fVar146 + fVar126;
                *(float *)(*pauVar25 + 8) = fVar125 * fVar147 + fVar126;
                *(float *)(*pauVar25 + 0xc) = fVar125 * fVar148 + fVar126;
                *(float *)(*pauVar25 + 0x10) = fVar125 * fVar149 + fVar126;
                *(float *)(*pauVar25 + 0x14) = fVar125 * fVar150 + fVar126;
                *(float *)(*pauVar25 + 0x18) = fVar125 * fVar151 + fVar126;
                *(float *)(*pauVar25 + 0x1c) = fVar125 + fVar126;
                pauVar25 = pauVar25 + 1;
                pfVar29 = pfVar29 + 1;
                pfVar16 = pfVar16 + 1;
                iVar17 = iVar17 + 8;
              } while (iVar17 <= (int)uVar28);
            }
            if (iVar18 == 4) {
              uVar32 = 4;
              if (7 < (int)uVar28) {
                in_ZMM2 = ZEXT3264(CONCAT1616(auVar114,auVar114));
                iVar17 = 8;
                do {
                  fVar125 = *pfVar29;
                  fVar126 = pfVar29[1];
                  fVar127 = *pfVar16;
                  fVar146 = pfVar16[1];
                  fVar147 = *(float *)(*pauVar25 + 4);
                  fVar148 = *(float *)(*pauVar25 + 8);
                  fVar149 = *(float *)(*pauVar25 + 0xc);
                  fVar150 = *(float *)(*pauVar25 + 0x10);
                  fVar151 = *(float *)(*pauVar25 + 0x14);
                  fVar4 = *(float *)(*pauVar25 + 0x18);
                  *(float *)*pauVar25 = fVar127 + fVar125 * (fVar35 * *(float *)*pauVar25 + fVar97);
                  *(float *)(*pauVar25 + 4) = fVar127 + fVar125 * (fVar98 * fVar147 + fVar207);
                  *(float *)(*pauVar25 + 8) = fVar127 + fVar125 * (fVar95 * fVar148 + fVar208);
                  *(float *)(*pauVar25 + 0xc) = fVar127 + fVar125 * (fVar96 * fVar149 + fVar209);
                  *(float *)(*pauVar25 + 0x10) = fVar146 + fVar126 * (fVar35 * fVar150 + fVar97);
                  *(float *)(*pauVar25 + 0x14) = fVar146 + fVar126 * (fVar98 * fVar151 + fVar207);
                  *(float *)(*pauVar25 + 0x18) = fVar146 + fVar126 * (fVar95 * fVar4 + fVar208);
                  *(float *)(*pauVar25 + 0x1c) = fVar146 + fVar126;
                  pauVar25 = pauVar25 + 1;
                  pfVar29 = pfVar29 + 2;
                  pfVar16 = pfVar16 + 2;
                  iVar17 = iVar17 + 8;
                } while (iVar17 <= (int)uVar28);
                auVar174 = ZEXT3264(_DAT_0054f040);
                uVar32 = uVar28 | 4;
              }
              for (; (int)uVar32 <= (int)uVar28; uVar32 = uVar32 + 4) {
                fVar125 = *pfVar29;
                fVar126 = *pfVar16;
                fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
                fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
                fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
                fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
                in_ZMM2 = ZEXT1664(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar146,fVar127))));
                *(float *)*pauVar25 = fVar125 * fVar127 + fVar126;
                *(float *)(*pauVar25 + 4) = fVar125 * fVar146 + fVar126;
                *(float *)(*pauVar25 + 8) = fVar125 * fVar147 + fVar126;
                *(float *)(*pauVar25 + 0xc) = fVar125 * fVar148 + fVar126;
                pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
                pfVar29 = pfVar29 + 1;
                pfVar16 = pfVar16 + 1;
              }
            }
            if (iVar18 == 1) {
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar115 = vshufps_avx(auVar115,auVar115,0);
              fVar207 = auVar115._0_4_;
              fVar208 = auVar115._4_4_;
              fVar209 = auVar115._8_4_;
              fVar125 = auVar115._12_4_;
              fVar98 = auVar114._0_4_;
              fVar95 = auVar114._4_4_;
              fVar96 = auVar114._8_4_;
              uVar32 = 0;
              if (7 < (int)uVar28) {
                iVar17 = 8;
                do {
                  auVar142._0_4_ = (fVar98 * *(float *)*pauVar25 + fVar207) * *pfVar29 + *pfVar16;
                  auVar142._4_4_ =
                       (fVar95 * *(float *)(*pauVar25 + 4) + fVar208) * pfVar29[1] + pfVar16[1];
                  auVar142._8_4_ =
                       (fVar96 * *(float *)(*pauVar25 + 8) + fVar209) * pfVar29[2] + pfVar16[2];
                  auVar142._12_4_ =
                       (auVar114._12_4_ * *(float *)(*pauVar25 + 0xc) + fVar125) * pfVar29[3] +
                       pfVar16[3];
                  auVar142._16_4_ =
                       (fVar98 * *(float *)(*pauVar25 + 0x10) + fVar207) * pfVar29[4] + pfVar16[4];
                  auVar142._20_4_ =
                       (fVar95 * *(float *)(*pauVar25 + 0x14) + fVar208) * pfVar29[5] + pfVar16[5];
                  auVar142._24_4_ =
                       (fVar96 * *(float *)(*pauVar25 + 0x18) + fVar209) * pfVar29[6] + pfVar16[6];
                  auVar142._28_4_ = in_ZMM2._28_4_ + fVar125 + pfVar16[7];
                  in_ZMM2 = ZEXT3264(auVar142);
                  *pauVar25 = auVar142;
                  pauVar25 = pauVar25 + 1;
                  pfVar29 = pfVar29 + 8;
                  pfVar16 = pfVar16 + 8;
                  iVar17 = iVar17 + 8;
                  uVar32 = uVar24;
                } while (iVar17 <= (int)uVar28);
              }
              uVar19 = uVar32 | 4;
              while ((int)uVar19 <= (int)uVar28) {
                fVar126 = *(float *)(*pauVar25 + 4);
                fVar127 = *(float *)(*pauVar25 + 8);
                fVar146 = *(float *)(*pauVar25 + 0xc);
                fVar147 = pfVar29[1];
                fVar148 = pfVar29[2];
                fVar149 = pfVar29[3];
                fVar150 = pfVar16[1];
                fVar151 = pfVar16[2];
                fVar4 = pfVar16[3];
                *(float *)*pauVar25 = (fVar207 + fVar98 * *(float *)*pauVar25) * *pfVar29 + *pfVar16
                ;
                *(float *)(*pauVar25 + 4) = (fVar208 + fVar95 * fVar126) * fVar147 + fVar150;
                *(float *)(*pauVar25 + 8) = (fVar209 + fVar96 * fVar127) * fVar148 + fVar151;
                *(float *)(*pauVar25 + 0xc) =
                     (fVar125 + auVar114._12_4_ * fVar146) * fVar149 + fVar4;
                pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
                pfVar29 = pfVar29 + 4;
                pfVar16 = pfVar16 + 4;
                uVar19 = uVar32 + 8;
                uVar32 = uVar32 + 4;
              }
              if (uVar28 - uVar32 != 0 && (int)uVar32 <= (int)uVar28) {
                lVar21 = 0;
                do {
                  *(float *)(*pauVar25 + lVar21 * 4) =
                       (fVar97 + fVar35 * *(float *)(*pauVar25 + lVar21 * 4)) * pfVar29[lVar21] +
                       pfVar16[lVar21];
                  lVar21 = lVar21 + 1;
                } while (uVar28 - uVar32 != (int)lVar21);
              }
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar23);
      }
    }
    else if ((iVar17 == 2) && (0 < (int)uVar24)) {
      uVar23 = iVar1 * iVar18;
      fVar34 = 1.0 / (float)iVar1;
      auVar153 = vshufps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),0);
      uVar28 = uVar23 & 0xfffffff8;
      uVar30 = 0;
      auVar174 = ZEXT3264(_DAT_0054f040);
      auVar254 = ZEXT3264(_DAT_0054f060);
      auVar175._8_8_ = 0x8000000000000000;
      auVar175._0_8_ = 0x8000000000000000;
      auVar134 = vpcmpeqd_avx(auVar114,auVar114);
      do {
        pauVar25 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar30 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar194 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar186 = ZEXT832(0) << 0x40;
        pauVar15 = pauVar25;
        uVar32 = 0;
        if (7 < (int)uVar23) {
          iVar17 = 8;
          do {
            auVar186._0_4_ = auVar194._0_4_ + *(float *)*pauVar15;
            auVar186._4_4_ = auVar194._4_4_ + *(float *)(*pauVar15 + 4);
            auVar186._8_4_ = auVar194._8_4_ + *(float *)(*pauVar15 + 8);
            auVar186._12_4_ = auVar194._12_4_ + *(float *)(*pauVar15 + 0xc);
            auVar186._16_4_ = auVar194._16_4_ + *(float *)(*pauVar15 + 0x10);
            auVar186._20_4_ = auVar194._20_4_ + *(float *)(*pauVar15 + 0x14);
            auVar186._24_4_ = auVar194._24_4_ + *(float *)(*pauVar15 + 0x18);
            auVar186._28_4_ = auVar194._28_4_ + *(float *)(*pauVar15 + 0x1c);
            auVar194 = ZEXT3264(auVar186);
            pauVar15 = pauVar15 + 1;
            iVar17 = iVar17 + 8;
            uVar32 = uVar28;
          } while (iVar17 <= (int)uVar23);
        }
        uVar19 = uVar32 | 4;
        auVar195 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar35 = auVar195._4_4_;
          fVar98 = auVar195._8_4_;
          fVar95 = auVar195._12_4_;
          if ((int)uVar23 < (int)uVar19) break;
          auVar195._0_4_ = auVar195._0_4_ + *(float *)*pauVar15;
          auVar195._4_4_ = fVar35 + *(float *)(*pauVar15 + 4);
          auVar195._8_4_ = fVar98 + *(float *)(*pauVar15 + 8);
          auVar195._12_4_ = fVar95 + *(float *)(*pauVar15 + 0xc);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar19 = uVar32 + 8;
          uVar32 = uVar32 + 4;
        }
        fVar96 = 0.0;
        if ((int)uVar32 < (int)uVar23) {
          uVar31 = CONCAT44(0,~uVar32 + uVar23);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar31;
          auVar178 = vpshufd_avx(auVar36,0x44);
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar115 = vorps_avx(auVar178,auVar175);
          uVar20 = 0;
          auVar194 = ZEXT464(0) << 0x40;
          do {
            auVar206 = auVar194;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar20;
            auVar168 = vpshufd_avx(auVar37,0x44);
            auVar70._16_16_ = auVar168;
            auVar70._0_16_ = auVar168;
            auVar93 = vorps_avx(auVar70,auVar174._0_32_);
            auVar94 = vorps_avx(auVar254._0_32_,auVar70);
            auVar168 = vorps_avx(auVar178,auVar175);
            auVar38._8_4_ = auVar94._24_4_;
            auVar38._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
            auVar38._12_4_ = auVar94._28_4_ ^ 0x80000000;
            auVar167 = vpcmpgtq_avx(auVar38,auVar168);
            auVar99._8_4_ = auVar94._8_4_;
            auVar236._8_4_ = auVar99._8_4_;
            auVar236._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
            auVar236._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar69 = vpcmpgtq_avx(auVar236,auVar114);
            auVar69 = vpackssdw_avx(auVar69,auVar167);
            auVar246._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
            auVar246._8_4_ = auVar93._24_4_;
            auVar246._12_4_ = auVar93._28_4_ ^ 0x80000000;
            auVar135 = vpcmpgtq_avx(auVar246,auVar168);
            auVar247._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
            auVar247._8_4_ = auVar93._8_4_;
            auVar247._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar168 = vpcmpgtq_avx(auVar247,auVar115);
            auVar168 = vpackssdw_avx(auVar168,auVar135);
            auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
            auVar69 = vpmovsxwd_avx(auVar168);
            auVar168 = vpunpckhwd_avx(auVar168,auVar168);
            auVar240._16_16_ = auVar168;
            auVar240._0_16_ = auVar69;
            auVar235 = vmaskmovps_avx(auVar240,*(undefined1 (*) [32])(*pauVar15 + uVar20 * 4));
            auVar210._0_4_ = auVar235._0_4_ + auVar206._0_4_;
            auVar210._4_4_ = auVar235._4_4_ + auVar206._4_4_;
            auVar210._8_4_ = auVar235._8_4_ + auVar206._8_4_;
            auVar210._12_4_ = auVar235._12_4_ + auVar206._12_4_;
            auVar214._16_4_ = auVar235._16_4_ + auVar206._16_4_;
            auVar214._0_16_ = auVar210;
            auVar214._20_4_ = auVar235._20_4_ + auVar206._20_4_;
            auVar214._24_4_ = auVar235._24_4_ + auVar206._24_4_;
            auVar214._28_4_ = auVar235._28_4_ + auVar206._28_4_;
            uVar20 = uVar20 + 8;
            auVar194 = ZEXT3264(auVar214);
          } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar99._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
          auVar99._12_4_ = auVar94._12_4_ ^ 0x80000000;
          auVar114 = vpcmpgtq_avx(auVar99,auVar114);
          auVar115 = vpackssdw_avx(auVar114,auVar167);
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar128._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
          auVar128._8_4_ = auVar93._8_4_;
          auVar128._12_4_ = auVar93._12_4_ ^ 0x80000000;
          auVar114 = vpcmpgtq_avx(auVar128,auVar114);
          auVar114 = vpackssdw_avx(auVar114,auVar135);
          auVar114 = vblendvps_avx(auVar206._0_16_,auVar210,auVar114 ^ auVar134);
          in_ZMM2 = ZEXT1664(auVar214._16_16_);
          auVar115 = vblendvps_avx(auVar206._16_16_,auVar214._16_16_,auVar115 ^ auVar134);
          auVar114 = vhaddps_avx(auVar115,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          fVar96 = auVar114._0_4_;
        }
        local_78 = auVar153._0_4_;
        fStack_74 = auVar153._4_4_;
        fStack_70 = auVar153._8_4_;
        fStack_6c = auVar153._12_4_;
        if (iVar18 == 4) {
          auVar195._0_4_ = auVar195._0_4_ + auVar186._16_4_ + auVar186._0_4_;
          auVar195._4_4_ = fVar35 + auVar186._20_4_ + auVar186._4_4_;
          auVar195._8_4_ = fVar98 + auVar186._24_4_ + auVar186._8_4_;
          auVar195._12_4_ = fVar95 + auVar186._28_4_ + auVar186._12_4_;
          auVar254 = ZEXT1664(CONCAT412(auVar195._12_4_ * fStack_6c,
                                        CONCAT48(auVar195._8_4_ * fStack_70,
                                                 CONCAT44(auVar195._4_4_ * fStack_74,
                                                          auVar195._0_4_ * local_78))));
        }
        else {
          auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
          if (iVar18 == 8) {
            auVar254 = ZEXT2864(CONCAT424(auVar186._24_4_ * fStack_70,
                                          CONCAT420(auVar186._20_4_ * fStack_74,
                                                    CONCAT416(auVar186._16_4_ * local_78,
                                                              CONCAT412(auVar186._12_4_ * fStack_6c,
                                                                        CONCAT48(auVar186._8_4_ *
                                                                                 fStack_70,
                                                                                 CONCAT44(auVar186.
                                                  _4_4_ * fStack_74,auVar186._0_4_ * local_78)))))))
            ;
          }
        }
        if (iVar18 == 1) {
          auVar114 = vshufpd_avx(auVar195,auVar195,1);
          auVar100._0_4_ = auVar195._0_4_ + auVar114._0_4_;
          auVar100._4_4_ = auVar195._4_4_ + auVar114._4_4_;
          auVar100._8_4_ = auVar195._8_4_ + auVar114._8_4_;
          auVar100._12_4_ = auVar195._12_4_ + auVar114._12_4_;
          auVar114 = vhaddps_avx(auVar186._16_16_,auVar186._0_16_);
          auVar115 = vmovshdup_avx(auVar100);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          fVar96 = fVar96 + auVar115._0_4_;
          in_ZMM2 = ZEXT464((uint)fVar96);
          auVar93 = vblendps_avx(auVar254._0_32_,
                                 ZEXT432((uint)((auVar114._0_4_ + auVar100._0_4_ + fVar96) * fVar34)
                                        ),1);
          auVar254 = ZEXT3264(auVar93);
        }
        auVar115 = auVar254._0_16_;
        auVar114 = auVar115;
        if (iVar18 != 4) {
          auVar114 = vshufps_avx(auVar115,auVar115,0);
        }
        auVar71 = auVar254._0_32_;
        if (iVar18 != 8) {
          auVar71._16_16_ = auVar114;
          auVar71._0_16_ = auVar114;
        }
        pauVar15 = pauVar25;
        if ((int)uVar23 < 8) {
          auVar215 = SUB6432(ZEXT864(0),0) << 0x20;
          uVar32 = 0;
        }
        else {
          auVar194 = ZEXT864(0) << 0x20;
          iVar17 = 8;
          do {
            auVar93 = vsubps_avx(*pauVar15,auVar71);
            auVar215._0_4_ = auVar194._0_4_ + auVar93._0_4_ * auVar93._0_4_;
            auVar215._4_4_ = auVar194._4_4_ + auVar93._4_4_ * auVar93._4_4_;
            auVar215._8_4_ = auVar194._8_4_ + auVar93._8_4_ * auVar93._8_4_;
            auVar215._12_4_ = auVar194._12_4_ + auVar93._12_4_ * auVar93._12_4_;
            auVar215._16_4_ = auVar194._16_4_ + auVar93._16_4_ * auVar93._16_4_;
            auVar215._20_4_ = auVar194._20_4_ + auVar93._20_4_ * auVar93._20_4_;
            auVar215._24_4_ = auVar194._24_4_ + auVar93._24_4_ * auVar93._24_4_;
            auVar215._28_4_ = auVar194._28_4_ + auVar93._28_4_;
            auVar194 = ZEXT3264(auVar215);
            pauVar15 = pauVar15 + 1;
            iVar17 = iVar17 + 8;
            uVar32 = uVar28;
          } while (iVar17 <= (int)uVar23);
        }
        uVar19 = uVar32 | 4;
        auVar221 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar35 = auVar221._4_4_;
          fVar98 = auVar221._8_4_;
          fVar95 = auVar221._12_4_;
          if ((int)uVar23 < (int)uVar19) break;
          auVar178 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar114);
          auVar221._0_4_ = auVar221._0_4_ + auVar178._0_4_ * auVar178._0_4_;
          auVar221._4_4_ = fVar35 + auVar178._4_4_ * auVar178._4_4_;
          auVar221._8_4_ = fVar98 + auVar178._8_4_ * auVar178._8_4_;
          auVar221._12_4_ = fVar95 + auVar178._12_4_ * auVar178._12_4_;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar19 = uVar32 + 8;
          uVar32 = uVar32 + 4;
        }
        fVar96 = 0.0;
        if ((int)uVar32 < (int)uVar23) {
          uVar31 = CONCAT44(0,~uVar32 + uVar23);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar31;
          auVar178 = vpshufd_avx(auVar39,0x44);
          auVar114 = vshufps_avx(auVar115,auVar115,0);
          auVar241._16_16_ = auVar114;
          auVar241._0_16_ = auVar114;
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar115 = vorps_avx(auVar178,auVar175);
          uVar20 = 0;
          auVar194 = ZEXT464(0) << 0x40;
          do {
            auVar206 = auVar194;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar20;
            auVar168 = vpshufd_avx(auVar40,0x44);
            auVar72._16_16_ = auVar168;
            auVar72._0_16_ = auVar168;
            auVar93 = vorps_avx(auVar72,auVar174._0_32_);
            auVar94 = vorps_avx(_DAT_0054f060,auVar72);
            auVar168 = vorps_avx(auVar178,auVar175);
            auVar41._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
            auVar41._8_4_ = auVar94._24_4_;
            auVar41._12_4_ = auVar94._28_4_ ^ 0x80000000;
            auVar167 = vpcmpgtq_avx(auVar41,auVar168);
            auVar226._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
            auVar101._8_4_ = auVar94._8_4_;
            auVar226._8_4_ = auVar101._8_4_;
            auVar226._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar69 = vpcmpgtq_avx(auVar226,auVar114);
            auVar69 = vpackssdw_avx(auVar69,auVar167);
            auVar155._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
            auVar155._8_4_ = auVar93._24_4_;
            auVar155._12_4_ = auVar93._28_4_ ^ 0x80000000;
            auVar135 = vpcmpgtq_avx(auVar155,auVar168);
            auVar156._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
            auVar156._8_4_ = auVar93._8_4_;
            auVar156._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar168 = vpcmpgtq_avx(auVar156,auVar115);
            auVar168 = vpackssdw_avx(auVar168,auVar135);
            auVar168 = vpackssdw_avx(auVar168 ^ auVar134,auVar69 ^ auVar134);
            auVar69 = vpmovsxwd_avx(auVar168);
            auVar168 = vpunpckhwd_avx(auVar168,auVar168);
            auVar171._16_16_ = auVar168;
            auVar171._0_16_ = auVar69;
            auVar235 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(*pauVar15 + uVar20 * 4));
            auVar235 = vsubps_avx(auVar235,auVar241);
            auVar227._0_4_ = auVar235._0_4_ * auVar235._0_4_ + auVar206._0_4_;
            auVar227._4_4_ = auVar235._4_4_ * auVar235._4_4_ + auVar206._4_4_;
            auVar227._8_4_ = auVar235._8_4_ * auVar235._8_4_ + auVar206._8_4_;
            auVar227._12_4_ = auVar235._12_4_ * auVar235._12_4_ + auVar206._12_4_;
            auVar232._16_4_ = auVar235._16_4_ * auVar235._16_4_ + auVar206._16_4_;
            auVar232._0_16_ = auVar227;
            auVar232._20_4_ = auVar235._20_4_ * auVar235._20_4_ + auVar206._20_4_;
            auVar232._24_4_ = auVar235._24_4_ * auVar235._24_4_ + auVar206._24_4_;
            auVar232._28_4_ = auVar235._28_4_ + auVar206._28_4_;
            auVar174 = ZEXT3264(_DAT_0054f040);
            uVar20 = uVar20 + 8;
            auVar194 = ZEXT3264(auVar232);
          } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar101._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
          auVar101._12_4_ = auVar94._12_4_ ^ 0x80000000;
          auVar114 = vpcmpgtq_avx(auVar101,auVar114);
          auVar115 = vpackssdw_avx(auVar114,auVar167);
          auVar114 = vorps_avx(auVar178,auVar175);
          auVar129._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
          auVar129._8_4_ = auVar93._8_4_;
          auVar129._12_4_ = auVar93._12_4_ ^ 0x80000000;
          auVar114 = vpcmpgtq_avx(auVar129,auVar114);
          auVar114 = vpackssdw_avx(auVar114,auVar135);
          auVar114 = vblendvps_avx(auVar206._0_16_,auVar227,auVar114 ^ auVar134);
          in_ZMM2 = ZEXT1664(auVar232._16_16_);
          auVar115 = vblendvps_avx(auVar206._16_16_,auVar232._16_16_,auVar115 ^ auVar134);
          auVar114 = vhaddps_avx(auVar115,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          fVar96 = auVar114._0_4_;
          auVar254 = ZEXT3264(auVar254._0_32_);
        }
        auVar114 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
        auVar74 = auVar254._0_32_;
        auVar187 = ZEXT1632(ZEXT816(0) << 0x40);
        if (iVar18 == 8) {
          auVar187._0_4_ = auVar215._0_4_ * local_78;
          auVar187._4_4_ = auVar215._4_4_ * fStack_74;
          auVar187._8_4_ = auVar215._8_4_ * fStack_70;
          auVar187._12_4_ = auVar215._12_4_ * fStack_6c;
          auVar187._16_4_ = auVar215._16_4_ * local_78;
          auVar187._20_4_ = auVar215._20_4_ * fStack_74;
          auVar187._24_4_ = auVar215._24_4_ * fStack_70;
          auVar187._28_4_ = 0;
        }
        if (iVar18 == 4) {
          auVar221._0_4_ = auVar221._0_4_ + auVar215._0_4_ + auVar215._16_4_;
          auVar221._4_4_ = fVar35 + auVar215._4_4_ + auVar215._20_4_;
          auVar221._8_4_ = fVar98 + auVar215._8_4_ + auVar215._24_4_;
          auVar221._12_4_ = fVar95 + auVar215._12_4_ + auVar215._28_4_;
          auVar187 = vblendps_avx(auVar187,ZEXT1632(CONCAT412(auVar221._12_4_ * fStack_6c,
                                                              CONCAT48(auVar221._8_4_ * fStack_70,
                                                                       CONCAT44(auVar221._4_4_ *
                                                                                fStack_74,
                                                                                auVar221._0_4_ *
                                                                                local_78)))),0xf);
        }
        if (iVar18 == 1) {
          auVar115 = vshufpd_avx(auVar221,auVar221,1);
          auVar102._0_4_ = auVar221._0_4_ + auVar115._0_4_;
          auVar102._4_4_ = auVar221._4_4_ + auVar115._4_4_;
          auVar102._8_4_ = auVar221._8_4_ + auVar115._8_4_;
          auVar102._12_4_ = auVar221._12_4_ + auVar115._12_4_;
          auVar115 = vhaddps_avx(auVar215._16_16_,auVar215._0_16_);
          auVar178 = vmovshdup_avx(auVar102);
          in_ZMM2 = ZEXT1664(auVar178);
          auVar115 = vhaddps_avx(auVar115,auVar115);
          auVar115 = vhaddps_avx(auVar115,auVar115);
          auVar187 = vblendps_avx(auVar187,ZEXT432((uint)((fVar96 + auVar115._0_4_ + auVar102._0_4_
                                                          + auVar178._0_4_) * fVar34)),1);
        }
        fVar35 = auVar187._0_4_;
        auVar183 = auVar187._0_28_;
        fVar98 = auVar254._0_4_;
        if (iVar18 == 1) {
          fVar35 = fVar35 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
          auVar114 = vrsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
          fVar95 = auVar114._0_4_;
          fVar35 = fVar95 * -0.5 * (fVar35 * fVar95 * fVar95 + -3.0);
          auVar93 = vblendps_avx(auVar187,ZEXT432((uint)fVar35),1);
          auVar183 = auVar93._0_28_;
          auVar74 = vblendps_avx(auVar74,ZEXT432((uint)(fVar35 * -fVar98)),1);
        }
        else if (iVar18 == 4) {
          auVar114 = vshufps_avx(auVar114,auVar114,0);
          auVar42._0_4_ = fVar35 + auVar114._0_4_;
          auVar42._4_4_ = auVar187._4_4_ + auVar114._4_4_;
          auVar42._8_4_ = auVar187._8_4_ + auVar114._8_4_;
          auVar42._12_4_ = auVar187._12_4_ + auVar114._12_4_;
          auVar114 = vrsqrtps_avx(auVar42);
          fVar35 = auVar114._0_4_;
          fVar95 = auVar114._4_4_;
          fVar96 = auVar114._8_4_;
          fVar97 = auVar114._12_4_;
          in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
          fVar35 = fVar35 * -0.5 * (auVar42._0_4_ * fVar35 * fVar35 + -3.0);
          fVar95 = fVar95 * -0.5 * (auVar42._4_4_ * fVar95 * fVar95 + -3.0);
          fVar96 = fVar96 * -0.5 * (auVar42._8_4_ * fVar96 * fVar96 + -3.0);
          fVar97 = fVar97 * -0.5 * (auVar42._12_4_ * fVar97 * fVar97 + -3.0);
          auVar93 = vblendps_avx(auVar187,ZEXT1632(CONCAT412(fVar97,CONCAT48(fVar96,CONCAT44(fVar95,
                                                  fVar35)))),0xf);
          auVar183 = auVar93._0_28_;
          auVar74 = vblendps_avx(auVar74,ZEXT1632(CONCAT412(fVar97 * -auVar254._12_4_,
                                                            CONCAT48(fVar96 * -auVar254._8_4_,
                                                                     CONCAT44(fVar95 * -auVar254.
                                                  _4_4_,fVar35 * -fVar98)))),0xf);
        }
        else if (iVar18 == 8) {
          auVar114 = vshufps_avx(auVar114,auVar114,0);
          auVar73._0_4_ = fVar35 + auVar114._0_4_;
          auVar73._4_4_ = auVar187._4_4_ + auVar114._4_4_;
          auVar73._8_4_ = auVar187._8_4_ + auVar114._8_4_;
          auVar73._12_4_ = auVar187._12_4_ + auVar114._12_4_;
          auVar73._16_4_ = auVar187._16_4_ + auVar114._0_4_;
          auVar73._20_4_ = auVar187._20_4_ + auVar114._4_4_;
          auVar73._24_4_ = auVar187._24_4_ + auVar114._8_4_;
          auVar73._28_4_ = auVar187._28_4_ + auVar114._12_4_;
          auVar93 = vrsqrtps_avx(auVar73);
          fVar35 = auVar93._0_4_;
          fVar95 = auVar93._4_4_;
          fVar96 = auVar93._8_4_;
          fVar97 = auVar93._12_4_;
          fVar207 = auVar93._16_4_;
          fVar208 = auVar93._20_4_;
          fVar209 = auVar93._24_4_;
          in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                       CONCAT424(0xbf000000,
                                                 CONCAT420(0xbf000000,
                                                           CONCAT416(0xbf000000,
                                                                     CONCAT412(0xbf000000,
                                                                               CONCAT48(0xbf000000,
                                                                                                                                                                                
                                                  0xbf000000bf000000)))))));
          auVar183._0_4_ = fVar35 * -0.5 * (auVar73._0_4_ * fVar35 * fVar35 + -3.0);
          auVar183._4_4_ = fVar95 * -0.5 * (auVar73._4_4_ * fVar95 * fVar95 + -3.0);
          auVar183._8_4_ = fVar96 * -0.5 * (auVar73._8_4_ * fVar96 * fVar96 + -3.0);
          auVar183._12_4_ = fVar97 * -0.5 * (auVar73._12_4_ * fVar97 * fVar97 + -3.0);
          auVar183._16_4_ = fVar207 * -0.5 * (auVar73._16_4_ * fVar207 * fVar207 + -3.0);
          auVar183._20_4_ = fVar208 * -0.5 * (auVar73._20_4_ * fVar208 * fVar208 + -3.0);
          auVar183._24_4_ = fVar209 * -0.5 * (auVar73._24_4_ * fVar209 * fVar209 + -3.0);
          auVar194._0_4_ = auVar183._0_4_ * -fVar98;
          auVar194._4_4_ = auVar183._4_4_ * -auVar254._4_4_;
          auVar194._8_4_ = auVar183._8_4_ * -auVar254._8_4_;
          auVar194._12_4_ = auVar183._12_4_ * -auVar254._12_4_;
          auVar194._16_4_ = auVar183._16_4_ * -auVar254._16_4_;
          auVar194._20_4_ = auVar183._20_4_ * -auVar254._20_4_;
          auVar194._28_36_ = auVar254._28_36_;
          auVar194._24_4_ = auVar183._24_4_ * -auVar254._24_4_;
          auVar74 = auVar194._0_32_;
        }
        auVar114 = auVar183._0_16_;
        auVar115 = auVar74._0_16_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          auVar168 = auVar115;
          auVar178 = auVar114;
          if (iVar18 != 4) {
            auVar178 = vshufps_avx(auVar114,auVar114,0);
            auVar168 = vshufps_avx(auVar115,auVar115,0);
          }
          if (iVar18 != 8) {
            auVar118._16_16_ = auVar178;
            auVar118._0_16_ = auVar178;
            auVar183 = auVar118._0_28_;
            auVar74._16_16_ = auVar168;
            auVar74._0_16_ = auVar168;
          }
          uVar32 = 0;
          if (7 < (int)uVar23) {
            iVar17 = 8;
            do {
              auVar139._0_4_ = auVar183._0_4_ * *(float *)*pauVar25 + auVar74._0_4_;
              auVar139._4_4_ = auVar183._4_4_ * *(float *)(*pauVar25 + 4) + auVar74._4_4_;
              auVar139._8_4_ = auVar183._8_4_ * *(float *)(*pauVar25 + 8) + auVar74._8_4_;
              auVar139._12_4_ = auVar183._12_4_ * *(float *)(*pauVar25 + 0xc) + auVar74._12_4_;
              auVar139._16_4_ = auVar183._16_4_ * *(float *)(*pauVar25 + 0x10) + auVar74._16_4_;
              auVar139._20_4_ = auVar183._20_4_ * *(float *)(*pauVar25 + 0x14) + auVar74._20_4_;
              auVar139._24_4_ = auVar183._24_4_ * *(float *)(*pauVar25 + 0x18) + auVar74._24_4_;
              auVar139._28_4_ = in_ZMM2._28_4_ + auVar74._28_4_;
              in_ZMM2 = ZEXT3264(auVar139);
              *pauVar25 = auVar139;
              pauVar25 = pauVar25 + 1;
              iVar17 = iVar17 + 8;
              uVar32 = uVar28;
            } while (iVar17 <= (int)uVar23);
          }
          uVar19 = uVar32 | 4;
          while ((int)uVar19 <= (int)uVar23) {
            fVar35 = *(float *)(*pauVar25 + 4);
            fVar98 = *(float *)(*pauVar25 + 8);
            fVar95 = *(float *)(*pauVar25 + 0xc);
            *(float *)*pauVar25 = auVar168._0_4_ + auVar178._0_4_ * *(float *)*pauVar25;
            *(float *)(*pauVar25 + 4) = auVar168._4_4_ + auVar178._4_4_ * fVar35;
            *(float *)(*pauVar25 + 8) = auVar168._8_4_ + auVar178._8_4_ * fVar98;
            *(float *)(*pauVar25 + 0xc) = auVar168._12_4_ + auVar178._12_4_ * fVar95;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
            uVar19 = uVar32 + 8;
            uVar32 = uVar32 + 4;
          }
          if ((int)uVar32 < (int)uVar23) {
            uVar31 = CONCAT44(0,~uVar32 + uVar23);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar31;
            auVar178 = vpshufd_avx(auVar43,0x44);
            auVar168 = vshufps_avx(auVar114,auVar114,0);
            auVar69 = vshufps_avx(auVar115,auVar115,0);
            auVar114 = vorps_avx(auVar178,auVar175);
            in_ZMM2 = ZEXT1664(auVar114);
            auVar115 = vorps_avx(auVar178,auVar175);
            uVar20 = 0;
            do {
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar20;
              auVar167 = vpshufd_avx(auVar44,0x44);
              auVar75._16_16_ = auVar167;
              auVar75._0_16_ = auVar167;
              auVar93 = vorps_avx(auVar75,auVar174._0_32_);
              auVar94 = vorps_avx(auVar75,_DAT_0054f060);
              auVar167 = vorps_avx(auVar178,auVar175);
              auVar157._0_8_ = auVar94._16_8_ ^ 0x8000000000000000;
              auVar157._8_4_ = auVar94._24_4_;
              auVar157._12_4_ = auVar94._28_4_ ^ 0x80000000;
              auVar135 = vpcmpgtq_avx(auVar157,auVar167);
              auVar45._0_8_ = auVar94._0_8_ ^ 0x8000000000000000;
              auVar45._8_4_ = auVar94._8_4_;
              auVar45._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar152 = vpcmpgtq_avx(auVar45,auVar114);
              auVar135 = vpackssdw_avx(auVar152,auVar135);
              auVar158._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
              auVar158._8_4_ = auVar93._24_4_;
              auVar158._12_4_ = auVar93._28_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar158,auVar167);
              auVar174 = ZEXT3264(_DAT_0054f040);
              auVar103._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
              auVar103._8_4_ = auVar93._8_4_;
              auVar103._12_4_ = auVar93._12_4_ ^ 0x80000000;
              auVar152 = vpcmpgtq_avx(auVar103,auVar115);
              auVar167 = vpackssdw_avx(auVar152,auVar167);
              auVar167 = vpackssdw_avx(auVar167 ^ auVar134,auVar135 ^ auVar134);
              auVar135 = vpmovsxwd_avx(auVar167);
              auVar167 = vpunpckhwd_avx(auVar167,auVar167);
              auVar76._16_16_ = auVar167;
              auVar76._0_16_ = auVar135;
              auVar93 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(*pauVar25 + uVar20 * 4));
              auVar119._0_4_ = auVar69._0_4_ + auVar93._0_4_ * auVar168._0_4_;
              auVar119._4_4_ = auVar69._4_4_ + auVar93._4_4_ * auVar168._4_4_;
              auVar119._8_4_ = auVar69._8_4_ + auVar93._8_4_ * auVar168._8_4_;
              auVar119._12_4_ = auVar69._12_4_ + auVar93._12_4_ * auVar168._12_4_;
              auVar119._16_4_ = auVar69._0_4_ + auVar93._16_4_ * auVar168._0_4_;
              auVar119._20_4_ = auVar69._4_4_ + auVar93._20_4_ * auVar168._4_4_;
              auVar119._24_4_ = auVar69._8_4_ + auVar93._24_4_ * auVar168._8_4_;
              auVar119._28_4_ = auVar69._12_4_ + auVar93._28_4_;
              auVar93 = vmaskmovps_avx(auVar76,auVar119);
              *(undefined1 (*) [32])(*pauVar25 + uVar20 * 4) = auVar93;
              uVar20 = uVar20 + 8;
            } while ((uVar31 + 8 & 0x1fffffff8) != uVar20);
          }
        }
        else {
          fVar35 = auVar183._0_4_;
          fVar98 = auVar183._4_4_;
          fVar95 = auVar183._8_4_;
          fVar96 = auVar183._12_4_;
          fVar97 = auVar74._0_4_;
          fVar207 = auVar74._4_4_;
          fVar208 = auVar74._8_4_;
          fVar209 = auVar74._12_4_;
          pfVar16 = pfVar22;
          pfVar29 = pfVar33;
          if (7 < (int)uVar23 && iVar18 == 8) {
            iVar17 = 8;
            do {
              fVar125 = *pfVar16;
              fVar126 = *pfVar29;
              fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
              fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
              fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
              fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
              fVar149 = auVar74._16_4_ + auVar183._16_4_ * *(float *)(*pauVar25 + 0x10);
              fVar150 = auVar74._20_4_ + auVar183._20_4_ * *(float *)(*pauVar25 + 0x14);
              fVar151 = auVar74._24_4_ + auVar183._24_4_ * *(float *)(*pauVar25 + 0x18);
              in_ZMM2 = ZEXT3264(CONCAT428(auVar74._28_4_ + in_ZMM2._28_4_,
                                           CONCAT424(fVar151,CONCAT420(fVar150,CONCAT416(fVar149,
                                                  CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(
                                                  fVar146,fVar127))))))));
              *(float *)*pauVar25 = fVar125 * fVar127 + fVar126;
              *(float *)(*pauVar25 + 4) = fVar125 * fVar146 + fVar126;
              *(float *)(*pauVar25 + 8) = fVar125 * fVar147 + fVar126;
              *(float *)(*pauVar25 + 0xc) = fVar125 * fVar148 + fVar126;
              *(float *)(*pauVar25 + 0x10) = fVar125 * fVar149 + fVar126;
              *(float *)(*pauVar25 + 0x14) = fVar125 * fVar150 + fVar126;
              *(float *)(*pauVar25 + 0x18) = fVar125 * fVar151 + fVar126;
              *(float *)(*pauVar25 + 0x1c) = fVar125 + fVar126;
              pauVar25 = pauVar25 + 1;
              pfVar16 = pfVar16 + 1;
              pfVar29 = pfVar29 + 1;
              iVar17 = iVar17 + 8;
            } while (iVar17 <= (int)uVar23);
          }
          if (iVar18 == 4) {
            uVar32 = 4;
            if (7 < (int)uVar23) {
              in_ZMM2 = ZEXT3264(CONCAT1616(auVar114,auVar114));
              iVar17 = 8;
              do {
                fVar125 = *pfVar16;
                fVar126 = pfVar16[1];
                fVar127 = *pfVar29;
                fVar146 = pfVar29[1];
                fVar147 = *(float *)(*pauVar25 + 4);
                fVar148 = *(float *)(*pauVar25 + 8);
                fVar149 = *(float *)(*pauVar25 + 0xc);
                fVar150 = *(float *)(*pauVar25 + 0x10);
                fVar151 = *(float *)(*pauVar25 + 0x14);
                fVar4 = *(float *)(*pauVar25 + 0x18);
                *(float *)*pauVar25 = fVar127 + fVar125 * (fVar35 * *(float *)*pauVar25 + fVar97);
                *(float *)(*pauVar25 + 4) = fVar127 + fVar125 * (fVar98 * fVar147 + fVar207);
                *(float *)(*pauVar25 + 8) = fVar127 + fVar125 * (fVar95 * fVar148 + fVar208);
                *(float *)(*pauVar25 + 0xc) = fVar127 + fVar125 * (fVar96 * fVar149 + fVar209);
                *(float *)(*pauVar25 + 0x10) = fVar146 + fVar126 * (fVar35 * fVar150 + fVar97);
                *(float *)(*pauVar25 + 0x14) = fVar146 + fVar126 * (fVar98 * fVar151 + fVar207);
                *(float *)(*pauVar25 + 0x18) = fVar146 + fVar126 * (fVar95 * fVar4 + fVar208);
                *(float *)(*pauVar25 + 0x1c) = fVar146 + fVar126;
                pauVar25 = pauVar25 + 1;
                pfVar16 = pfVar16 + 2;
                pfVar29 = pfVar29 + 2;
                iVar17 = iVar17 + 8;
              } while (iVar17 <= (int)uVar23);
              auVar174 = ZEXT3264(_DAT_0054f040);
              uVar32 = uVar23 | 4;
            }
            for (; (int)uVar32 <= (int)uVar23; uVar32 = uVar32 + 4) {
              fVar125 = *pfVar16;
              fVar126 = *pfVar29;
              fVar127 = fVar97 + fVar35 * *(float *)*pauVar25;
              fVar146 = fVar207 + fVar98 * *(float *)(*pauVar25 + 4);
              fVar147 = fVar208 + fVar95 * *(float *)(*pauVar25 + 8);
              fVar148 = fVar209 + fVar96 * *(float *)(*pauVar25 + 0xc);
              in_ZMM2 = ZEXT1664(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar146,fVar127))));
              *(float *)*pauVar25 = fVar125 * fVar127 + fVar126;
              *(float *)(*pauVar25 + 4) = fVar125 * fVar146 + fVar126;
              *(float *)(*pauVar25 + 8) = fVar125 * fVar147 + fVar126;
              *(float *)(*pauVar25 + 0xc) = fVar125 * fVar148 + fVar126;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              pfVar16 = pfVar16 + 1;
              pfVar29 = pfVar29 + 1;
            }
          }
          if (iVar18 == 1) {
            auVar114 = vshufps_avx(auVar114,auVar114,0);
            auVar115 = vshufps_avx(auVar115,auVar115,0);
            fVar207 = auVar115._0_4_;
            fVar208 = auVar115._4_4_;
            fVar209 = auVar115._8_4_;
            fVar125 = auVar115._12_4_;
            fVar98 = auVar114._0_4_;
            fVar95 = auVar114._4_4_;
            fVar96 = auVar114._8_4_;
            uVar32 = 0;
            if (7 < (int)uVar23) {
              iVar17 = 8;
              do {
                auVar138._0_4_ = (fVar98 * *(float *)*pauVar25 + fVar207) * *pfVar16 + *pfVar29;
                auVar138._4_4_ =
                     (fVar95 * *(float *)(*pauVar25 + 4) + fVar208) * pfVar16[1] + pfVar29[1];
                auVar138._8_4_ =
                     (fVar96 * *(float *)(*pauVar25 + 8) + fVar209) * pfVar16[2] + pfVar29[2];
                auVar138._12_4_ =
                     (auVar114._12_4_ * *(float *)(*pauVar25 + 0xc) + fVar125) * pfVar16[3] +
                     pfVar29[3];
                auVar138._16_4_ =
                     (fVar98 * *(float *)(*pauVar25 + 0x10) + fVar207) * pfVar16[4] + pfVar29[4];
                auVar138._20_4_ =
                     (fVar95 * *(float *)(*pauVar25 + 0x14) + fVar208) * pfVar16[5] + pfVar29[5];
                auVar138._24_4_ =
                     (fVar96 * *(float *)(*pauVar25 + 0x18) + fVar209) * pfVar16[6] + pfVar29[6];
                auVar138._28_4_ = in_ZMM2._28_4_ + fVar125 + pfVar29[7];
                in_ZMM2 = ZEXT3264(auVar138);
                *pauVar25 = auVar138;
                pauVar25 = pauVar25 + 1;
                pfVar16 = pfVar16 + 8;
                pfVar29 = pfVar29 + 8;
                iVar17 = iVar17 + 8;
                uVar32 = uVar28;
              } while (iVar17 <= (int)uVar23);
            }
            uVar19 = uVar32 | 4;
            while ((int)uVar19 <= (int)uVar23) {
              fVar126 = *(float *)(*pauVar25 + 4);
              fVar127 = *(float *)(*pauVar25 + 8);
              fVar146 = *(float *)(*pauVar25 + 0xc);
              fVar147 = pfVar16[1];
              fVar148 = pfVar16[2];
              fVar149 = pfVar16[3];
              fVar150 = pfVar29[1];
              fVar151 = pfVar29[2];
              fVar4 = pfVar29[3];
              *(float *)*pauVar25 = (fVar207 + fVar98 * *(float *)*pauVar25) * *pfVar16 + *pfVar29;
              *(float *)(*pauVar25 + 4) = (fVar208 + fVar95 * fVar126) * fVar147 + fVar150;
              *(float *)(*pauVar25 + 8) = (fVar209 + fVar96 * fVar127) * fVar148 + fVar151;
              *(float *)(*pauVar25 + 0xc) = (fVar125 + auVar114._12_4_ * fVar146) * fVar149 + fVar4;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              pfVar16 = pfVar16 + 4;
              pfVar29 = pfVar29 + 4;
              uVar19 = uVar32 + 8;
              uVar32 = uVar32 + 4;
            }
            if (uVar23 - uVar32 != 0 && (int)uVar32 <= (int)uVar23) {
              lVar21 = 0;
              do {
                *(float *)(*pauVar25 + lVar21 * 4) =
                     (fVar97 + fVar35 * *(float *)(*pauVar25 + lVar21 * 4)) * pfVar16[lVar21] +
                     pfVar29[lVar21];
                lVar21 = lVar21 + 1;
              } while (uVar23 - uVar32 != (int)lVar21);
            }
          }
        }
        uVar30 = uVar30 + 1;
        auVar254 = ZEXT3264(_DAT_0054f060);
      } while (uVar30 != uVar24);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}